

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  bool bVar41;
  bool bVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  int iVar107;
  float fVar108;
  undefined4 uVar109;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  vint4 bi;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vfloat4 b0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar154;
  float fVar162;
  float fVar163;
  vint4 ai_2;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar204;
  float fVar205;
  __m128 a;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar226;
  float fVar227;
  float fVar237;
  float fVar239;
  vfloat4 a0_2;
  undefined1 auVar228 [16];
  float fVar238;
  float fVar240;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  vfloat4 b0_2;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  vfloat4 a0_3;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar283 [64];
  int iVar284;
  undefined1 in_ZMM31 [64];
  undefined1 auVar285 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_595;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar34;
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  float fVar136;
  float fVar153;
  undefined1 auVar265 [32];
  
  PVar4 = prim[1];
  uVar33 = (ulong)(byte)PVar4;
  lVar38 = uVar33 * 0x25;
  fVar108 = *(float *)(prim + lVar38 + 0x12);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar44 = vsubps_avx(auVar44,*(undefined1 (*) [16])(prim + lVar38 + 6));
  auVar68._0_4_ = fVar108 * auVar44._0_4_;
  auVar68._4_4_ = fVar108 * auVar44._4_4_;
  auVar68._8_4_ = fVar108 * auVar44._8_4_;
  auVar68._12_4_ = fVar108 * auVar44._12_4_;
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 4 + 6)));
  auVar54._0_4_ = fVar108 * auVar45._0_4_;
  auVar54._4_4_ = fVar108 * auVar45._4_4_;
  auVar54._8_4_ = fVar108 * auVar45._8_4_;
  auVar54._12_4_ = fVar108 * auVar45._12_4_;
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 5 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 6 + 6)));
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0xf + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar33 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1a + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1b + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1c + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar74._4_4_ = auVar54._0_4_;
  auVar74._0_4_ = auVar54._0_4_;
  auVar74._8_4_ = auVar54._0_4_;
  auVar74._12_4_ = auVar54._0_4_;
  auVar49 = vshufps_avx(auVar54,auVar54,0x55);
  auVar47 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar108 = auVar47._0_4_;
  auVar72._0_4_ = fVar108 * auVar58._0_4_;
  fVar113 = auVar47._4_4_;
  auVar72._4_4_ = fVar113 * auVar58._4_4_;
  fVar243 = auVar47._8_4_;
  auVar72._8_4_ = fVar243 * auVar58._8_4_;
  fVar227 = auVar47._12_4_;
  auVar72._12_4_ = fVar227 * auVar58._12_4_;
  auVar62._0_4_ = auVar65._0_4_ * fVar108;
  auVar62._4_4_ = auVar65._4_4_ * fVar113;
  auVar62._8_4_ = auVar65._8_4_ * fVar243;
  auVar62._12_4_ = auVar65._12_4_ * fVar227;
  auVar55._0_4_ = auVar46._0_4_ * fVar108;
  auVar55._4_4_ = auVar46._4_4_ * fVar113;
  auVar55._8_4_ = auVar46._8_4_ * fVar243;
  auVar55._12_4_ = auVar46._12_4_ * fVar227;
  auVar47 = vfmadd231ps_fma(auVar72,auVar49,auVar45);
  auVar48 = vfmadd231ps_fma(auVar62,auVar49,auVar64);
  auVar49 = vfmadd231ps_fma(auVar55,auVar67,auVar49);
  auVar50 = vfmadd231ps_fma(auVar47,auVar74,auVar44);
  auVar48 = vfmadd231ps_fma(auVar48,auVar74,auVar59);
  auVar51 = vfmadd231ps_fma(auVar49,auVar66,auVar74);
  auVar266._4_4_ = auVar68._0_4_;
  auVar266._0_4_ = auVar68._0_4_;
  auVar266._8_4_ = auVar68._0_4_;
  auVar266._12_4_ = auVar68._0_4_;
  auVar49 = vshufps_avx(auVar68,auVar68,0x55);
  auVar47 = vshufps_avx(auVar68,auVar68,0xaa);
  fVar108 = auVar47._0_4_;
  auVar165._0_4_ = fVar108 * auVar58._0_4_;
  fVar113 = auVar47._4_4_;
  auVar165._4_4_ = fVar113 * auVar58._4_4_;
  fVar243 = auVar47._8_4_;
  auVar165._8_4_ = fVar243 * auVar58._8_4_;
  fVar227 = auVar47._12_4_;
  auVar165._12_4_ = fVar227 * auVar58._12_4_;
  auVar70._0_4_ = auVar65._0_4_ * fVar108;
  auVar70._4_4_ = auVar65._4_4_ * fVar113;
  auVar70._8_4_ = auVar65._8_4_ * fVar243;
  auVar70._12_4_ = auVar65._12_4_ * fVar227;
  auVar69._0_4_ = auVar46._0_4_ * fVar108;
  auVar69._4_4_ = auVar46._4_4_ * fVar113;
  auVar69._8_4_ = auVar46._8_4_ * fVar243;
  auVar69._12_4_ = auVar46._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar165,auVar49,auVar45);
  auVar58 = vfmadd231ps_fma(auVar70,auVar49,auVar64);
  auVar64 = vfmadd231ps_fma(auVar69,auVar49,auVar67);
  auVar53 = vfmadd231ps_fma(auVar45,auVar266,auVar44);
  auVar54 = vfmadd231ps_fma(auVar58,auVar266,auVar59);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar282 = ZEXT1664(auVar44);
  auVar55 = vfmadd231ps_fma(auVar64,auVar266,auVar66);
  auVar45 = vandps_avx512vl(auVar50,auVar44);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  uVar43 = vcmpps_avx512vl(auVar45,auVar191,1);
  bVar41 = (bool)((byte)uVar43 & 1);
  auVar56._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar50._0_4_;
  bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar50._4_4_;
  bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar50._8_4_;
  bVar41 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar50._12_4_;
  auVar45 = vandps_avx512vl(auVar48,auVar44);
  uVar43 = vcmpps_avx512vl(auVar45,auVar191,1);
  bVar41 = (bool)((byte)uVar43 & 1);
  auVar57._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar48._0_4_;
  bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar48._4_4_;
  bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar48._8_4_;
  bVar41 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar48._12_4_;
  auVar44 = vandps_avx512vl(auVar51,auVar44);
  uVar43 = vcmpps_avx512vl(auVar44,auVar191,1);
  bVar41 = (bool)((byte)uVar43 & 1);
  auVar60._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar51._0_4_;
  bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar51._4_4_;
  bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar51._8_4_;
  bVar41 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar51._12_4_;
  auVar45 = vrcp14ps_avx512vl(auVar56);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = &DAT_3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar44 = vfnmadd213ps_fma(auVar56,auVar45,auVar192);
  auVar50 = vfmadd132ps_fma(auVar44,auVar45,auVar45);
  auVar45 = vrcp14ps_avx512vl(auVar57);
  auVar44 = vfnmadd213ps_fma(auVar57,auVar45,auVar192);
  auVar51 = vfmadd132ps_fma(auVar44,auVar45,auVar45);
  auVar45 = vrcp14ps_avx512vl(auVar60);
  auVar44 = vfnmadd213ps_fma(auVar60,auVar45,auVar192);
  auVar52 = vfmadd132ps_fma(auVar44,auVar45,auVar45);
  fVar108 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar38 + 0x16)) *
            *(float *)(prim + lVar38 + 0x1a);
  auVar180._4_4_ = fVar108;
  auVar180._0_4_ = fVar108;
  auVar180._8_4_ = fVar108;
  auVar180._12_4_ = fVar108;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar33 * 7 + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar33 * 0xb + 6);
  auVar45 = vpmovsxwd_avx(auVar45);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar59 = vsubps_avx(auVar45,auVar44);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar33 * 9 + 6);
  auVar45 = vpmovsxwd_avx(auVar58);
  auVar58 = vfmadd213ps_fma(auVar59,auVar180,auVar44);
  auVar44 = vcvtdq2ps_avx(auVar45);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar33 * 0xd + 6);
  auVar45 = vpmovsxwd_avx(auVar59);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar59 = vfmadd213ps_fma(auVar45,auVar180,auVar44);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar33 * 0x12 + 6);
  auVar44 = vpmovsxwd_avx(auVar64);
  auVar44 = vcvtdq2ps_avx(auVar44);
  uVar43 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar33 * 2 + uVar43 + 6);
  auVar45 = vpmovsxwd_avx(auVar65);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar64 = vfmadd213ps_fma(auVar45,auVar180,auVar44);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar43 + 6);
  auVar44 = vpmovsxwd_avx(auVar66);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar33 * 0x18 + 6);
  auVar45 = vpmovsxwd_avx(auVar67);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar65 = vfmadd213ps_fma(auVar45,auVar180,auVar44);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar33 * 0x1d + 6);
  auVar44 = vpmovsxwd_avx(auVar46);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar33 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar45 = vpmovsxwd_avx(auVar49);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar66 = vfmadd213ps_fma(auVar45,auVar180,auVar44);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar33) + 6);
  auVar44 = vpmovsxwd_avx(auVar47);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar33 * 0x23 + 6);
  auVar45 = vpmovsxwd_avx(auVar48);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar45 = vfmadd213ps_fma(auVar45,auVar180,auVar44);
  auVar44 = vsubps_avx(auVar58,auVar53);
  auVar181._0_4_ = auVar50._0_4_ * auVar44._0_4_;
  auVar181._4_4_ = auVar50._4_4_ * auVar44._4_4_;
  auVar181._8_4_ = auVar50._8_4_ * auVar44._8_4_;
  auVar181._12_4_ = auVar50._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar59,auVar53);
  auVar73._0_4_ = auVar50._0_4_ * auVar44._0_4_;
  auVar73._4_4_ = auVar50._4_4_ * auVar44._4_4_;
  auVar73._8_4_ = auVar50._8_4_ * auVar44._8_4_;
  auVar73._12_4_ = auVar50._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar64,auVar54);
  auVar166._0_4_ = auVar51._0_4_ * auVar44._0_4_;
  auVar166._4_4_ = auVar51._4_4_ * auVar44._4_4_;
  auVar166._8_4_ = auVar51._8_4_ * auVar44._8_4_;
  auVar166._12_4_ = auVar51._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar65,auVar54);
  auVar63._0_4_ = auVar51._0_4_ * auVar44._0_4_;
  auVar63._4_4_ = auVar51._4_4_ * auVar44._4_4_;
  auVar63._8_4_ = auVar51._8_4_ * auVar44._8_4_;
  auVar63._12_4_ = auVar51._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar66,auVar55);
  auVar71._0_4_ = auVar52._0_4_ * auVar44._0_4_;
  auVar71._4_4_ = auVar52._4_4_ * auVar44._4_4_;
  auVar71._8_4_ = auVar52._8_4_ * auVar44._8_4_;
  auVar71._12_4_ = auVar52._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar45,auVar55);
  auVar61._0_4_ = auVar52._0_4_ * auVar44._0_4_;
  auVar61._4_4_ = auVar52._4_4_ * auVar44._4_4_;
  auVar61._8_4_ = auVar52._8_4_ * auVar44._8_4_;
  auVar61._12_4_ = auVar52._12_4_ * auVar44._12_4_;
  auVar44 = vpminsd_avx(auVar181,auVar73);
  auVar45 = vpminsd_avx(auVar166,auVar63);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar45 = vpminsd_avx(auVar71,auVar61);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar50._4_4_ = uVar109;
  auVar50._0_4_ = uVar109;
  auVar50._8_4_ = uVar109;
  auVar50._12_4_ = uVar109;
  auVar45 = vmaxps_avx512vl(auVar45,auVar50);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar51._8_4_ = 0x3f7ffffa;
  auVar51._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar51._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar44,auVar51);
  auVar44 = vpmaxsd_avx(auVar181,auVar73);
  auVar45 = vpmaxsd_avx(auVar166,auVar63);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar45 = vpmaxsd_avx(auVar71,auVar61);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar52._4_4_ = uVar109;
  auVar52._0_4_ = uVar109;
  auVar52._8_4_ = uVar109;
  auVar52._12_4_ = uVar109;
  auVar45 = vminps_avx512vl(auVar45,auVar52);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar53._8_4_ = 0x3f800003;
  auVar53._0_8_ = 0x3f8000033f800003;
  auVar53._12_4_ = 0x3f800003;
  auVar44 = vmulps_avx512vl(auVar44,auVar53);
  auVar45 = vpbroadcastd_avx512vl();
  uVar21 = vcmpps_avx512vl(local_3a0,auVar44,2);
  uVar43 = vpcmpgtd_avx512vl(auVar45,_DAT_01ff0cf0);
  uVar43 = ((byte)uVar21 & 0xf) & uVar43;
  bVar41 = (char)uVar43 == '\0';
  local_595 = !bVar41;
  if (bVar41) {
    return local_595;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar44 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar285 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar280 = ZEXT1664(auVar44);
LAB_01c9973f:
  lVar38 = 0;
  for (uVar33 = uVar43; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    lVar38 = lVar38 + 1;
  }
  uVar40 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar40].ptr;
  fVar108 = (pGVar6->time_range).lower;
  fVar108 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar108) / ((pGVar6->time_range).upper - fVar108));
  auVar44 = vroundss_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),9);
  auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar46 = vmaxss_avx512f(auVar285._0_16_,auVar44);
  uVar33 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar38 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar37 = (long)(int)auVar46._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + 0x10 + lVar37);
  auVar44 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar37) + lVar8 * uVar33);
  lVar38 = uVar33 + 1;
  auVar45 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar37) + lVar8 * lVar38);
  p_Var9 = pGVar6[4].occlusionFilterN;
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar8 + 0x10 + lVar37);
  auVar58 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar37) + lVar10 * uVar33);
  auVar59 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar37) + lVar10 * lVar38);
  _Var11 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar10 = *(long *)(_Var11 + 0x10 + lVar37);
  lVar12 = *(long *)(_Var7 + 0x38 + lVar37);
  lVar13 = *(long *)(_Var7 + 0x48 + lVar37);
  auVar64 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar33);
  auVar65 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar38);
  lVar12 = *(long *)(lVar8 + 0x38 + lVar37);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar37);
  auVar66 = *(undefined1 (*) [16])(lVar12 + lVar8 * uVar33);
  auVar67 = *(undefined1 (*) [16])(lVar12 + lVar8 * lVar38);
  auVar75 = vpbroadcastd_avx512vl();
  local_200 = vmovdqa64_avx512vl(auVar75);
  lVar8 = *(long *)(_Var11 + 0x38 + lVar37);
  lVar12 = *(long *)(_Var11 + 0x48 + lVar37);
  auVar90._16_16_ = auVar75._16_16_;
  auVar47 = vsubss_avx512f(ZEXT416((uint)fVar108),auVar46);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar46 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar37) + *(long *)(p_Var9 + lVar37 + 0x10) * uVar33),
                       auVar44,auVar48);
  auVar49 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar37) + *(long *)(p_Var9 + lVar37 + 0x10) * lVar38),
                       auVar45,auVar48);
  auVar50 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar37) + lVar10 * uVar33),auVar58,
                       auVar48);
  auVar51 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar37) + lVar10 * lVar38),auVar59,
                       auVar48);
  auVar90._0_16_ = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
  auVar52 = vmulps_avx512vl(auVar45,auVar90._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar90._0_16_);
  auVar53 = vpxord_avx512vl(auVar75._0_16_,auVar75._0_16_);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar46,auVar52);
  auVar53 = vaddps_avx512vl(auVar44,auVar53);
  auVar72 = auVar280._0_16_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar46,auVar72);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar44,auVar72);
  auVar54 = vmulps_avx512vl(auVar59,auVar90._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar90._0_16_);
  auVar55 = vxorps_avx512vl(auVar72,auVar72);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar50,auVar54);
  auVar56 = vaddps_avx512vl(auVar58,auVar55);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar50,auVar72);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar58,auVar72);
  auVar55 = vxorps_avx512vl(auVar55,auVar55);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar49,auVar45);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar46,auVar90._0_16_);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar44,auVar90._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar72);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar72,auVar49);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar90._0_16_,auVar46);
  auVar57 = vfnmadd231ps_avx512vl(auVar45,auVar90._0_16_,auVar44);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar59);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar50,auVar90._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar90._0_16_);
  fVar108 = auVar280._0_4_;
  auVar127._0_4_ = auVar59._0_4_ * fVar108;
  fVar113 = auVar280._4_4_;
  auVar127._4_4_ = auVar59._4_4_ * fVar113;
  fVar243 = auVar280._8_4_;
  auVar127._8_4_ = auVar59._8_4_ * fVar243;
  fVar227 = auVar280._12_4_;
  auVar127._12_4_ = auVar59._12_4_ * fVar227;
  auVar44 = vfnmadd231ps_fma(auVar127,auVar72,auVar51);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar50);
  auVar49 = vfnmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar58);
  auVar44 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar58 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  fVar154 = auVar52._0_4_;
  auVar167._0_4_ = fVar154 * auVar58._0_4_;
  fVar162 = auVar52._4_4_;
  auVar167._4_4_ = fVar162 * auVar58._4_4_;
  fVar163 = auVar52._8_4_;
  auVar167._8_4_ = fVar163 * auVar58._8_4_;
  fVar164 = auVar52._12_4_;
  auVar167._12_4_ = fVar164 * auVar58._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar167,auVar44,auVar56);
  auVar58 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar59 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar182._0_4_ = fVar154 * auVar59._0_4_;
  auVar182._4_4_ = fVar162 * auVar59._4_4_;
  auVar182._8_4_ = fVar163 * auVar59._8_4_;
  auVar182._12_4_ = fVar164 * auVar59._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar182,auVar44,auVar54);
  auVar59 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar50 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar44 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar44 = vmulps_avx512vl(auVar57,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar50,auVar45);
  auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar44 = vmulps_avx512vl(auVar57,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar50,auVar49);
  auVar49 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar75._4_28_ = auVar90._4_28_;
  auVar75._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar75._0_16_);
  auVar50 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3f000000));
  auVar51 = vmulss_avx512f(auVar51,auVar45);
  auVar45 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar45._0_4_ * auVar45._0_4_)));
  fVar136 = auVar50._0_4_ - auVar45._0_4_;
  auVar207._4_4_ = fVar136;
  auVar207._0_4_ = fVar136;
  auVar207._8_4_ = fVar136;
  auVar207._12_4_ = fVar136;
  auVar45 = vdpps_avx(auVar58,auVar59,0x7f);
  auVar50 = vmulps_avx512vl(auVar58,auVar207);
  auVar51 = vbroadcastss_avx512vl(auVar44);
  auVar59 = vmulps_avx512vl(auVar51,auVar59);
  fVar238 = auVar45._0_4_;
  auVar168._0_4_ = fVar238 * auVar58._0_4_;
  auVar168._4_4_ = fVar238 * auVar58._4_4_;
  auVar168._8_4_ = fVar238 * auVar58._8_4_;
  auVar168._12_4_ = fVar238 * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar59,auVar168);
  auVar45 = vrcp14ss_avx512f(auVar90._0_16_,auVar75._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar45,ZEXT416(0x40000000));
  fVar238 = auVar45._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar76._16_16_ = auVar90._16_16_;
  auVar76._0_16_ = auVar90._0_16_;
  auVar92._4_28_ = auVar76._4_28_;
  auVar92._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar92._0_16_);
  auVar59 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3f000000));
  fVar239 = auVar45._0_4_;
  fVar153 = auVar59._0_4_ - auVar51._0_4_ * fVar239 * fVar239 * fVar239;
  auVar208._0_4_ = auVar46._0_4_ * fVar153;
  auVar208._4_4_ = auVar46._4_4_ * fVar153;
  auVar208._8_4_ = auVar46._8_4_ * fVar153;
  auVar208._12_4_ = auVar46._12_4_ * fVar153;
  auVar45 = vdpps_avx(auVar46,auVar49,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar44);
  auVar59 = vmulps_avx512vl(auVar59,auVar49);
  fVar239 = auVar45._0_4_;
  auVar110._0_4_ = fVar239 * auVar46._0_4_;
  auVar110._4_4_ = fVar239 * auVar46._4_4_;
  auVar110._8_4_ = fVar239 * auVar46._8_4_;
  auVar110._12_4_ = fVar239 * auVar46._12_4_;
  auVar45 = vsubps_avx(auVar59,auVar110);
  auVar59 = vrcp14ss_avx512f(auVar90._0_16_,auVar92._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar59,ZEXT416(0x40000000));
  fVar239 = auVar59._0_4_ * auVar44._0_4_;
  auVar59 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar46 = vmulps_avx512vl(auVar59,auVar50);
  auVar51 = vsubps_avx512vl(auVar53,auVar46);
  auVar44 = vshufps_avx(auVar52,auVar52,0xff);
  auVar44 = vmulps_avx512vl(auVar44,auVar50);
  auVar137._0_4_ = auVar44._0_4_ + auVar59._0_4_ * fVar136 * fVar238 * auVar58._0_4_;
  auVar137._4_4_ = auVar44._4_4_ + auVar59._4_4_ * fVar136 * fVar238 * auVar58._4_4_;
  auVar137._8_4_ = auVar44._8_4_ + auVar59._8_4_ * fVar136 * fVar238 * auVar58._8_4_;
  auVar137._12_4_ = auVar44._12_4_ + auVar59._12_4_ * fVar136 * fVar238 * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar52,auVar137);
  auVar50 = vaddps_avx512vl(auVar53,auVar46);
  auVar183._0_4_ = fVar154 + auVar137._0_4_;
  auVar183._4_4_ = fVar162 + auVar137._4_4_;
  auVar183._8_4_ = fVar163 + auVar137._8_4_;
  auVar183._12_4_ = fVar164 + auVar137._12_4_;
  auVar58 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar218._0_4_ = auVar208._0_4_ * auVar58._0_4_;
  auVar218._4_4_ = auVar208._4_4_ * auVar58._4_4_;
  auVar218._8_4_ = auVar208._8_4_ * auVar58._8_4_;
  auVar218._12_4_ = auVar208._12_4_ * auVar58._12_4_;
  auVar52 = vsubps_avx512vl(auVar55,auVar218);
  auVar59 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar46 = vmulps_avx512vl(auVar59,auVar208);
  auVar169._0_4_ = auVar46._0_4_ + auVar58._0_4_ * fVar153 * auVar45._0_4_ * fVar239;
  auVar169._4_4_ = auVar46._4_4_ + auVar58._4_4_ * fVar153 * auVar45._4_4_ * fVar239;
  auVar169._8_4_ = auVar46._8_4_ + auVar58._8_4_ * fVar153 * auVar45._8_4_ * fVar239;
  auVar169._12_4_ = auVar46._12_4_ + auVar58._12_4_ * fVar153 * auVar45._12_4_ * fVar239;
  auVar45 = vsubps_avx512vl(auVar57,auVar169);
  auVar53 = vaddps_avx512vl(auVar55,auVar218);
  auVar58 = vaddps_avx512vl(auVar57,auVar169);
  auVar44 = vmulps_avx512vl(auVar44,auVar48);
  auVar193._0_4_ = auVar51._0_4_ + auVar44._0_4_;
  auVar193._4_4_ = auVar51._4_4_ + auVar44._4_4_;
  auVar193._8_4_ = auVar51._8_4_ + auVar44._8_4_;
  auVar193._12_4_ = auVar51._12_4_ + auVar44._12_4_;
  auVar44 = vmulps_avx512vl(auVar45,auVar48);
  auVar46 = vsubps_avx(auVar52,auVar44);
  auVar44 = vmulps_avx512vl(auVar183,auVar48);
  auVar54 = vaddps_avx512vl(auVar50,auVar44);
  auVar44 = vmulps_avx512vl(auVar58,auVar48);
  auVar56 = vsubps_avx512vl(auVar53,auVar44);
  auVar45 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar37 + 0x38) +
                        *(long *)(p_Var9 + lVar37 + 0x48) * uVar33),auVar64,auVar48);
  auVar58 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar37 + 0x38) +
                        *(long *)(p_Var9 + lVar37 + 0x48) * lVar38),auVar65,auVar48);
  auVar57 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + uVar33 * lVar12),auVar66,auVar48);
  auVar60 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + lVar12 * lVar38),auVar67,auVar48);
  auVar44 = vmulps_avx512vl(auVar65,auVar90._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar90._0_16_);
  auVar59 = vxorps_avx512vl(auVar59,auVar59);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar45,auVar44);
  auVar61 = vaddps_avx512vl(auVar64,auVar59);
  auVar44 = vfmadd231ps_fma(auVar44,auVar45,auVar72);
  auVar49 = vfnmadd231ps_fma(auVar44,auVar64,auVar72);
  auVar44 = vmulps_avx512vl(auVar67,auVar90._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar90._0_16_);
  auVar59 = vxorps_avx512vl(auVar55,auVar55);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar57,auVar44);
  auVar55 = vaddps_avx512vl(auVar66,auVar59);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar72);
  auVar62 = vfnmadd231ps_avx512vl(auVar44,auVar66,auVar72);
  auVar44 = vxorps_avx512vl(auVar59,auVar59);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar58,auVar65);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar45,auVar90._0_16_);
  auVar63 = vfmadd231ps_avx512vl(auVar44,auVar64,auVar90._0_16_);
  auVar244._0_4_ = auVar65._0_4_ * fVar108;
  auVar244._4_4_ = auVar65._4_4_ * fVar113;
  auVar244._8_4_ = auVar65._8_4_ * fVar243;
  auVar244._12_4_ = auVar65._12_4_ * fVar227;
  auVar44 = vfnmadd231ps_fma(auVar244,auVar72,auVar58);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar45);
  auVar64 = vfnmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar64);
  auVar44 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar60,auVar67);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar90._0_16_);
  auVar65 = vfmadd231ps_avx512vl(auVar44,auVar66,auVar90._0_16_);
  auVar259._0_4_ = auVar67._0_4_ * fVar108;
  auVar259._4_4_ = auVar67._4_4_ * fVar113;
  auVar259._8_4_ = auVar67._8_4_ * fVar243;
  auVar259._12_4_ = auVar67._12_4_ * fVar227;
  auVar44 = vfnmadd231ps_avx512vl(auVar259,auVar72,auVar60);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar57);
  auVar66 = vfnmadd231ps_avx512vl(auVar44,auVar90._0_16_,auVar66);
  auVar44 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar45 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  fVar243 = auVar49._0_4_;
  auVar267._0_4_ = fVar243 * auVar45._0_4_;
  fVar227 = auVar49._4_4_;
  auVar267._4_4_ = fVar227 * auVar45._4_4_;
  fVar238 = auVar49._8_4_;
  auVar267._8_4_ = fVar238 * auVar45._8_4_;
  fVar239 = auVar49._12_4_;
  auVar267._12_4_ = fVar239 * auVar45._12_4_;
  auVar45 = vfmsub231ps_avx512vl(auVar267,auVar44,auVar55);
  auVar58 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar274._0_4_ = fVar243 * auVar45._0_4_;
  auVar274._4_4_ = fVar227 * auVar45._4_4_;
  auVar274._8_4_ = fVar238 * auVar45._8_4_;
  auVar274._12_4_ = fVar239 * auVar45._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar274,auVar44,auVar62);
  auVar59 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar45 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar44 = vshufps_avx512vl(auVar65,auVar65,0xc9);
  auVar44 = vmulps_avx512vl(auVar64,auVar44);
  auVar44 = vfmsub231ps_avx512vl(auVar44,auVar45,auVar65);
  auVar65 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar67 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  auVar44 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar67 = vmulps_avx512vl(auVar64,auVar67);
  auVar45 = vfmsub231ps_avx512vl(auVar67,auVar45,auVar66);
  auVar66 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar93._16_16_ = auVar90._16_16_;
  auVar93._0_16_ = auVar90._0_16_;
  auVar77._4_28_ = auVar93._4_28_;
  auVar77._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar77._0_16_);
  auVar67 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar44,ZEXT416(0x3f000000));
  auVar55 = vmulss_avx512f(auVar55,auVar45);
  auVar45 = vmulss_avx512f(auVar45,auVar45);
  auVar45 = vmulss_avx512f(auVar55,auVar45);
  auVar45 = vsubss_avx512f(auVar67,auVar45);
  auVar67 = vbroadcastss_avx512vl(auVar45);
  auVar55 = vmulps_avx512vl(auVar58,auVar67);
  auVar45 = vdpps_avx(auVar58,auVar59,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar44);
  auVar59 = vmulps_avx512vl(auVar57,auVar59);
  fVar108 = auVar45._0_4_;
  auVar170._0_4_ = auVar58._0_4_ * fVar108;
  auVar170._4_4_ = auVar58._4_4_ * fVar108;
  auVar170._8_4_ = auVar58._8_4_ * fVar108;
  auVar170._12_4_ = auVar58._12_4_ * fVar108;
  auVar45 = vsubps_avx(auVar59,auVar170);
  auVar58 = vrcp14ss_avx512f(auVar90._0_16_,auVar77._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar58,ZEXT416(0x40000000));
  fVar108 = auVar58._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar65,auVar65,0x7f);
  auVar114._0_4_ = fVar108 * auVar45._0_4_;
  auVar114._4_4_ = fVar108 * auVar45._4_4_;
  auVar114._8_4_ = fVar108 * auVar45._8_4_;
  auVar114._12_4_ = fVar108 * auVar45._12_4_;
  auVar58 = vmulps_avx512vl(auVar67,auVar114);
  auVar79._16_16_ = auVar90._16_16_;
  auVar79._0_16_ = auVar90._0_16_;
  auVar78._4_28_ = auVar79._4_28_;
  auVar78._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar78._0_16_);
  auVar59 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar44,ZEXT416(0x3f000000));
  auVar283 = ZEXT464(0x3f800000);
  auVar67 = vmulss_avx512f(auVar67,auVar45);
  auVar45 = vmulss_avx512f(auVar67,ZEXT416((uint)(auVar45._0_4_ * auVar45._0_4_)));
  fVar113 = auVar59._0_4_ - auVar45._0_4_;
  auVar275._0_4_ = auVar65._0_4_ * fVar113;
  auVar275._4_4_ = auVar65._4_4_ * fVar113;
  auVar275._8_4_ = auVar65._8_4_ * fVar113;
  auVar275._12_4_ = auVar65._12_4_ * fVar113;
  auVar45 = vdpps_avx(auVar65,auVar66,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar44);
  auVar59 = vmulps_avx512vl(auVar59,auVar66);
  fVar108 = auVar45._0_4_;
  auVar184._0_4_ = auVar65._0_4_ * fVar108;
  auVar184._4_4_ = auVar65._4_4_ * fVar108;
  auVar184._8_4_ = auVar65._8_4_ * fVar108;
  auVar184._12_4_ = auVar65._12_4_ * fVar108;
  auVar45 = vsubps_avx(auVar59,auVar184);
  auVar59 = vrcp14ss_avx512f(auVar90._0_16_,auVar78._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar59,ZEXT416(0x40000000));
  fVar108 = auVar44._0_4_ * auVar59._0_4_;
  auVar59 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar65 = vmulps_avx512vl(auVar59,auVar55);
  auVar66 = vsubps_avx512vl(auVar61,auVar65);
  auVar44 = vshufps_avx(auVar49,auVar49,0xff);
  auVar44 = vmulps_avx512vl(auVar44,auVar55);
  auVar115._0_4_ = auVar44._0_4_ + auVar59._0_4_ * auVar58._0_4_;
  auVar115._4_4_ = auVar44._4_4_ + auVar59._4_4_ * auVar58._4_4_;
  auVar115._8_4_ = auVar44._8_4_ + auVar59._8_4_ * auVar58._8_4_;
  auVar115._12_4_ = auVar44._12_4_ + auVar59._12_4_ * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar49,auVar115);
  auVar58 = vaddps_avx512vl(auVar61,auVar65);
  auVar116._0_4_ = fVar243 + auVar115._0_4_;
  auVar116._4_4_ = fVar227 + auVar115._4_4_;
  auVar116._8_4_ = fVar238 + auVar115._8_4_;
  auVar116._12_4_ = fVar239 + auVar115._12_4_;
  auVar59 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar260._0_4_ = auVar59._0_4_ * auVar275._0_4_;
  auVar260._4_4_ = auVar59._4_4_ * auVar275._4_4_;
  auVar260._8_4_ = auVar59._8_4_ * auVar275._8_4_;
  auVar260._12_4_ = auVar59._12_4_ * auVar275._12_4_;
  auVar65 = vsubps_avx512vl(auVar63,auVar260);
  auVar67 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar67 = vmulps_avx512vl(auVar67,auVar275);
  auVar171._0_4_ = auVar67._0_4_ + auVar59._0_4_ * fVar113 * auVar45._0_4_ * fVar108;
  auVar171._4_4_ = auVar67._4_4_ + auVar59._4_4_ * fVar113 * auVar45._4_4_ * fVar108;
  auVar171._8_4_ = auVar67._8_4_ + auVar59._8_4_ * fVar113 * auVar45._8_4_ * fVar108;
  auVar171._12_4_ = auVar67._12_4_ + auVar59._12_4_ * fVar113 * auVar45._12_4_ * fVar108;
  auVar45 = vsubps_avx(auVar64,auVar171);
  auVar59 = vaddps_avx512vl(auVar63,auVar260);
  auVar172._0_4_ = auVar64._0_4_ + auVar171._0_4_;
  auVar172._4_4_ = auVar64._4_4_ + auVar171._4_4_;
  auVar172._8_4_ = auVar64._8_4_ + auVar171._8_4_;
  auVar172._12_4_ = auVar64._12_4_ + auVar171._12_4_;
  auVar44 = vmulps_avx512vl(auVar44,auVar48);
  auVar185._0_4_ = auVar66._0_4_ + auVar44._0_4_;
  auVar185._4_4_ = auVar66._4_4_ + auVar44._4_4_;
  auVar185._8_4_ = auVar66._8_4_ + auVar44._8_4_;
  auVar185._12_4_ = auVar66._12_4_ + auVar44._12_4_;
  auVar44 = vmulps_avx512vl(auVar45,auVar48);
  auVar44 = vsubps_avx(auVar65,auVar44);
  auVar45 = vmulps_avx512vl(auVar116,auVar48);
  auVar117._0_4_ = auVar58._0_4_ + auVar45._0_4_;
  auVar117._4_4_ = auVar58._4_4_ + auVar45._4_4_;
  auVar117._8_4_ = auVar58._8_4_ + auVar45._8_4_;
  auVar117._12_4_ = auVar58._12_4_ + auVar45._12_4_;
  auVar45 = vmulps_avx512vl(auVar172,auVar48);
  auVar45 = vsubps_avx(auVar59,auVar45);
  auVar64 = vbroadcastss_avx512vl(auVar47);
  auVar67 = vsubss_avx512f(ZEXT416(0x3f800000),auVar47);
  auVar276._0_4_ = auVar67._0_4_;
  auVar276._4_4_ = auVar276._0_4_;
  auVar276._8_4_ = auVar276._0_4_;
  auVar276._12_4_ = auVar276._0_4_;
  auVar66 = vmulps_avx512vl(auVar64,auVar66);
  auVar67 = vmulps_avx512vl(auVar64,auVar185);
  auVar44 = vmulps_avx512vl(auVar64,auVar44);
  auVar268._0_4_ = auVar64._0_4_ * auVar65._0_4_;
  auVar268._4_4_ = auVar64._4_4_ * auVar65._4_4_;
  auVar268._8_4_ = auVar64._8_4_ * auVar65._8_4_;
  auVar268._12_4_ = auVar64._12_4_ * auVar65._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar66,auVar276,auVar51);
  local_330 = vfmadd231ps_avx512vl(auVar67,auVar276,auVar193);
  local_340 = vfmadd231ps_avx512vl(auVar44,auVar276,auVar46);
  local_350 = vfmadd231ps_fma(auVar268,auVar276,auVar52);
  auVar44 = vmulps_avx512vl(auVar64,auVar58);
  auVar58 = vmulps_avx512vl(auVar64,auVar117);
  auVar45 = vmulps_avx512vl(auVar64,auVar45);
  auVar261._0_4_ = auVar64._0_4_ * auVar59._0_4_;
  auVar261._4_4_ = auVar64._4_4_ * auVar59._4_4_;
  auVar261._8_4_ = auVar64._8_4_ * auVar59._8_4_;
  auVar261._12_4_ = auVar64._12_4_ * auVar59._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar44,auVar276,auVar50);
  _local_370 = vfmadd231ps_avx512vl(auVar58,auVar276,auVar54);
  _local_380 = vfmadd231ps_avx512vl(auVar45,auVar276,auVar56);
  _local_390 = vfmadd231ps_fma(auVar261,auVar276,auVar53);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2a0 = vsubps_avx512vl(local_320,auVar44);
  uVar109 = local_2a0._0_4_;
  auVar118._4_4_ = uVar109;
  auVar118._0_4_ = uVar109;
  auVar118._8_4_ = uVar109;
  auVar118._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar58 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar108 = pre->ray_space[k].vz.field_0.m128[0];
  fVar113 = pre->ray_space[k].vz.field_0.m128[1];
  fVar243 = pre->ray_space[k].vz.field_0.m128[2];
  fVar227 = pre->ray_space[k].vz.field_0.m128[3];
  auVar111._0_4_ = fVar108 * auVar58._0_4_;
  auVar111._4_4_ = fVar113 * auVar58._4_4_;
  auVar111._8_4_ = fVar243 * auVar58._8_4_;
  auVar111._12_4_ = fVar227 * auVar58._12_4_;
  auVar45 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar3,auVar45);
  auVar67 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar118);
  local_2b0 = vsubps_avx512vl(local_330,auVar44);
  uVar109 = local_2b0._0_4_;
  auVar138._4_4_ = uVar109;
  auVar138._0_4_ = uVar109;
  auVar138._8_4_ = uVar109;
  auVar138._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar58 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar119._0_4_ = fVar108 * auVar58._0_4_;
  auVar119._4_4_ = fVar113 * auVar58._4_4_;
  auVar119._8_4_ = fVar243 * auVar58._8_4_;
  auVar119._12_4_ = fVar227 * auVar58._12_4_;
  auVar45 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar3,auVar45);
  auVar46 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar138);
  local_2c0 = vsubps_avx512vl(local_340,auVar44);
  uVar109 = local_2c0._0_4_;
  auVar139._4_4_ = uVar109;
  auVar139._0_4_ = uVar109;
  auVar139._8_4_ = uVar109;
  auVar139._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar58 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar209._0_4_ = auVar58._0_4_ * fVar108;
  auVar209._4_4_ = auVar58._4_4_ * fVar113;
  auVar209._8_4_ = auVar58._8_4_ * fVar243;
  auVar209._12_4_ = auVar58._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar3,auVar45);
  auVar49 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar139);
  local_2d0 = vsubps_avx(local_350,auVar44);
  uVar109 = local_2d0._0_4_;
  auVar140._4_4_ = uVar109;
  auVar140._0_4_ = uVar109;
  auVar140._8_4_ = uVar109;
  auVar140._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar58 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar219._0_4_ = auVar58._0_4_ * fVar108;
  auVar219._4_4_ = auVar58._4_4_ * fVar113;
  auVar219._8_4_ = auVar58._8_4_ * fVar243;
  auVar219._12_4_ = auVar58._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar3,auVar45);
  auVar47 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar140);
  local_2e0 = vsubps_avx512vl(_local_360,auVar44);
  uVar109 = local_2e0._0_4_;
  auVar141._4_4_ = uVar109;
  auVar141._0_4_ = uVar109;
  auVar141._8_4_ = uVar109;
  auVar141._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar58 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar228._0_4_ = auVar58._0_4_ * fVar108;
  auVar228._4_4_ = auVar58._4_4_ * fVar113;
  auVar228._8_4_ = auVar58._8_4_ * fVar243;
  auVar228._12_4_ = auVar58._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar3,auVar45);
  auVar48 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar141);
  local_2f0 = vsubps_avx512vl(_local_370,auVar44);
  uVar109 = local_2f0._0_4_;
  auVar142._4_4_ = uVar109;
  auVar142._0_4_ = uVar109;
  auVar142._8_4_ = uVar109;
  auVar142._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar58 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar245._0_4_ = auVar58._0_4_ * fVar108;
  auVar245._4_4_ = auVar58._4_4_ * fVar113;
  auVar245._8_4_ = auVar58._8_4_ * fVar243;
  auVar245._12_4_ = auVar58._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar3,auVar45);
  auVar50 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar142);
  local_300 = vsubps_avx512vl(_local_380,auVar44);
  uVar109 = local_300._0_4_;
  auVar143._4_4_ = uVar109;
  auVar143._0_4_ = uVar109;
  auVar143._8_4_ = uVar109;
  auVar143._12_4_ = uVar109;
  auVar45 = vshufps_avx(local_300,local_300,0x55);
  auVar58 = vshufps_avx(local_300,local_300,0xaa);
  auVar252._0_4_ = auVar58._0_4_ * fVar108;
  auVar252._4_4_ = auVar58._4_4_ * fVar113;
  auVar252._8_4_ = auVar58._8_4_ * fVar243;
  auVar252._12_4_ = auVar58._12_4_ * fVar227;
  auVar45 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar3,auVar45);
  auVar51 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar143);
  local_310 = vsubps_avx(_local_390,auVar44);
  uVar109 = local_310._0_4_;
  auVar128._4_4_ = uVar109;
  auVar128._0_4_ = uVar109;
  auVar128._8_4_ = uVar109;
  auVar128._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_310,local_310,0x55);
  auVar45 = vshufps_avx(local_310,local_310,0xaa);
  auVar186._0_4_ = fVar108 * auVar45._0_4_;
  auVar186._4_4_ = fVar113 * auVar45._4_4_;
  auVar186._8_4_ = fVar243 * auVar45._8_4_;
  auVar186._12_4_ = fVar227 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar44);
  auVar52 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar128);
  auVar66 = vmovlhps_avx512f(auVar67,auVar48);
  auVar58 = vmovlhps_avx(auVar46,auVar50);
  auVar59 = vmovlhps_avx(auVar49,auVar51);
  auVar64 = vmovlhps_avx(auVar47,auVar52);
  auVar45 = vminps_avx512vl(auVar66,auVar58);
  auVar65 = vmaxps_avx512vl(auVar66,auVar58);
  auVar44 = vminps_avx(auVar59,auVar64);
  auVar45 = vminps_avx(auVar45,auVar44);
  auVar44 = vmaxps_avx(auVar59,auVar64);
  auVar44 = vmaxps_avx(auVar65,auVar44);
  auVar65 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vminps_avx(auVar45,auVar65);
  auVar65 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vmaxps_avx(auVar44,auVar65);
  auVar45 = vandps_avx512vl(auVar45,auVar282._0_16_);
  auVar44 = vandps_avx512vl(auVar44,auVar282._0_16_);
  auVar44 = vmaxps_avx(auVar45,auVar44);
  auVar45 = vmovshdup_avx(auVar44);
  auVar44 = vmaxss_avx(auVar45,auVar44);
  fVar113 = auVar44._0_4_ * 9.536743e-07;
  auVar45 = vmovddup_avx512vl(auVar67);
  auVar65 = vmovddup_avx512vl(auVar46);
  auVar210._0_8_ = auVar49._0_8_;
  auVar210._8_8_ = auVar210._0_8_;
  auVar220._0_8_ = auVar47._0_8_;
  auVar220._8_8_ = auVar220._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar113));
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar44 = vxorps_avx512vl(local_1c0._0_16_,auVar24);
  local_1e0 = vbroadcastss_avx512vl(auVar44);
  bVar41 = false;
  uVar33 = 0;
  fVar108 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar58,auVar66);
  local_280 = vsubps_avx(auVar59,auVar58);
  local_290 = vsubps_avx(auVar64,auVar59);
  local_3b0 = vsubps_avx512vl(_local_360,local_320);
  local_3c0 = vsubps_avx512vl(_local_370,local_330);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  _local_3e0 = vsubps_avx(_local_390,local_350);
  local_220 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar279 = ZEXT1664(auVar44);
  do {
    auVar56 = auVar279._0_16_;
    auVar46 = vshufps_avx512vl(auVar56,auVar56,0x50);
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = &DAT_3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._0_16_ = auVar262;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar67 = vsubps_avx(auVar262,auVar46);
    fVar243 = auVar46._0_4_;
    fVar136 = auVar48._0_4_;
    auVar144._0_4_ = fVar136 * fVar243;
    fVar227 = auVar46._4_4_;
    fVar153 = auVar48._4_4_;
    auVar144._4_4_ = fVar153 * fVar227;
    fVar238 = auVar46._8_4_;
    auVar144._8_4_ = fVar136 * fVar238;
    fVar239 = auVar46._12_4_;
    auVar144._12_4_ = fVar153 * fVar239;
    fVar154 = auVar50._0_4_;
    auVar155._0_4_ = fVar154 * fVar243;
    fVar162 = auVar50._4_4_;
    auVar155._4_4_ = fVar162 * fVar227;
    auVar155._8_4_ = fVar154 * fVar238;
    auVar155._12_4_ = fVar162 * fVar239;
    fVar226 = auVar51._0_4_;
    auVar173._0_4_ = fVar226 * fVar243;
    fVar237 = auVar51._4_4_;
    auVar173._4_4_ = fVar237 * fVar227;
    auVar173._8_4_ = fVar226 * fVar238;
    auVar173._12_4_ = fVar237 * fVar239;
    fVar163 = auVar52._0_4_;
    auVar120._0_4_ = fVar163 * fVar243;
    fVar164 = auVar52._4_4_;
    auVar120._4_4_ = fVar164 * fVar227;
    auVar120._8_4_ = fVar163 * fVar238;
    auVar120._12_4_ = fVar164 * fVar239;
    auVar47 = vfmadd231ps_avx512vl(auVar144,auVar67,auVar45);
    auVar53 = vfmadd231ps_avx512vl(auVar155,auVar67,auVar65);
    auVar46 = vfmadd231ps_fma(auVar173,auVar67,auVar210);
    auVar49 = vfmadd231ps_fma(auVar120,auVar220,auVar67);
    auVar67 = vmovshdup_avx(auVar44);
    fVar227 = auVar44._0_4_;
    fVar243 = (auVar67._0_4_ - fVar227) * 0.04761905;
    auVar150._4_4_ = fVar227;
    auVar150._0_4_ = fVar227;
    auVar150._8_4_ = fVar227;
    auVar150._12_4_ = fVar227;
    auVar150._16_4_ = fVar227;
    auVar150._20_4_ = fVar227;
    auVar150._24_4_ = fVar227;
    auVar150._28_4_ = fVar227;
    auVar85._0_8_ = auVar67._0_8_;
    auVar85._8_8_ = auVar85._0_8_;
    auVar85._16_8_ = auVar85._0_8_;
    auVar85._24_8_ = auVar85._0_8_;
    auVar75 = vsubps_avx(auVar85,auVar150);
    uVar109 = auVar47._0_4_;
    auVar95._4_4_ = uVar109;
    auVar95._0_4_ = uVar109;
    auVar95._8_4_ = uVar109;
    auVar95._12_4_ = uVar109;
    auVar95._16_4_ = uVar109;
    auVar95._20_4_ = uVar109;
    auVar95._24_4_ = uVar109;
    auVar95._28_4_ = uVar109;
    auVar86._8_4_ = 1;
    auVar86._0_8_ = 0x100000001;
    auVar86._12_4_ = 1;
    auVar86._16_4_ = 1;
    auVar86._20_4_ = 1;
    auVar86._24_4_ = 1;
    auVar86._28_4_ = 1;
    auVar92 = ZEXT1632(auVar47);
    auVar90 = vpermps_avx2(auVar86,auVar92);
    auVar76 = vbroadcastss_avx512vl(auVar53);
    auVar93 = ZEXT1632(auVar53);
    auVar77 = vpermps_avx512vl(auVar86,auVar93);
    auVar78 = vbroadcastss_avx512vl(auVar46);
    auVar91 = ZEXT1632(auVar46);
    auVar79 = vpermps_avx512vl(auVar86,auVar91);
    auVar80 = vbroadcastss_avx512vl(auVar49);
    auVar89 = ZEXT1632(auVar49);
    auVar81 = vpermps_avx512vl(auVar86,auVar89);
    auVar224._4_4_ = fVar243;
    auVar224._0_4_ = fVar243;
    auVar224._8_4_ = fVar243;
    auVar224._12_4_ = fVar243;
    auVar224._16_4_ = fVar243;
    auVar224._20_4_ = fVar243;
    auVar224._24_4_ = fVar243;
    auVar224._28_4_ = fVar243;
    auVar87._8_4_ = 2;
    auVar87._0_8_ = 0x200000002;
    auVar87._12_4_ = 2;
    auVar87._16_4_ = 2;
    auVar87._20_4_ = 2;
    auVar87._24_4_ = 2;
    auVar87._28_4_ = 2;
    auVar82 = vpermps_avx512vl(auVar87,auVar92);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar84 = vpermps_avx512vl(auVar83,auVar92);
    auVar92 = vpermps_avx2(auVar87,auVar93);
    auVar85 = vpermps_avx512vl(auVar83,auVar93);
    auVar93 = vpermps_avx2(auVar87,auVar91);
    auVar86 = vpermps_avx512vl(auVar83,auVar91);
    auVar87 = vpermps_avx512vl(auVar87,auVar89);
    auVar88 = vpermps_avx512vl(auVar83,auVar89);
    auVar67 = vfmadd132ps_fma(auVar75,auVar150,_DAT_02020f20);
    auVar75 = vsubps_avx(auVar265,ZEXT1632(auVar67));
    auVar83 = vmulps_avx512vl(auVar76,ZEXT1632(auVar67));
    auVar91 = ZEXT1632(auVar67);
    auVar89 = vmulps_avx512vl(auVar77,auVar91);
    auVar46 = vfmadd231ps_fma(auVar83,auVar75,auVar95);
    auVar49 = vfmadd231ps_fma(auVar89,auVar75,auVar90);
    auVar83 = vmulps_avx512vl(auVar78,auVar91);
    auVar89 = vmulps_avx512vl(auVar79,auVar91);
    auVar76 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar89,auVar75,auVar77);
    auVar83 = vmulps_avx512vl(auVar80,auVar91);
    auVar95 = ZEXT1632(auVar67);
    auVar81 = vmulps_avx512vl(auVar81,auVar95);
    auVar78 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar79);
    fVar238 = auVar67._0_4_;
    fVar239 = auVar67._4_4_;
    auVar81._4_4_ = fVar239 * auVar76._4_4_;
    auVar81._0_4_ = fVar238 * auVar76._0_4_;
    fVar240 = auVar67._8_4_;
    auVar81._8_4_ = fVar240 * auVar76._8_4_;
    fVar241 = auVar67._12_4_;
    auVar81._12_4_ = fVar241 * auVar76._12_4_;
    auVar81._16_4_ = auVar76._16_4_ * 0.0;
    auVar81._20_4_ = auVar76._20_4_ * 0.0;
    auVar81._24_4_ = auVar76._24_4_ * 0.0;
    auVar81._28_4_ = fVar227;
    auVar83._4_4_ = fVar239 * auVar77._4_4_;
    auVar83._0_4_ = fVar238 * auVar77._0_4_;
    auVar83._8_4_ = fVar240 * auVar77._8_4_;
    auVar83._12_4_ = fVar241 * auVar77._12_4_;
    auVar83._16_4_ = auVar77._16_4_ * 0.0;
    auVar83._20_4_ = auVar77._20_4_ * 0.0;
    auVar83._24_4_ = auVar77._24_4_ * 0.0;
    auVar83._28_4_ = auVar90._28_4_;
    auVar46 = vfmadd231ps_fma(auVar81,auVar75,ZEXT1632(auVar46));
    auVar49 = vfmadd231ps_fma(auVar83,auVar75,ZEXT1632(auVar49));
    auVar94._0_4_ = fVar238 * auVar78._0_4_;
    auVar94._4_4_ = fVar239 * auVar78._4_4_;
    auVar94._8_4_ = fVar240 * auVar78._8_4_;
    auVar94._12_4_ = fVar241 * auVar78._12_4_;
    auVar94._16_4_ = auVar78._16_4_ * 0.0;
    auVar94._20_4_ = auVar78._20_4_ * 0.0;
    auVar94._24_4_ = auVar78._24_4_ * 0.0;
    auVar94._28_4_ = 0;
    auVar89._4_4_ = fVar239 * auVar79._4_4_;
    auVar89._0_4_ = fVar238 * auVar79._0_4_;
    auVar89._8_4_ = fVar240 * auVar79._8_4_;
    auVar89._12_4_ = fVar241 * auVar79._12_4_;
    auVar89._16_4_ = auVar79._16_4_ * 0.0;
    auVar89._20_4_ = auVar79._20_4_ * 0.0;
    auVar89._24_4_ = auVar79._24_4_ * 0.0;
    auVar89._28_4_ = auVar78._28_4_;
    auVar47 = vfmadd231ps_fma(auVar94,auVar75,auVar76);
    auVar53 = vfmadd231ps_fma(auVar89,auVar75,auVar77);
    auVar91._28_4_ = auVar77._28_4_;
    auVar91._0_28_ =
         ZEXT1628(CONCAT412(fVar241 * auVar53._12_4_,
                            CONCAT48(fVar240 * auVar53._8_4_,
                                     CONCAT44(fVar239 * auVar53._4_4_,fVar238 * auVar53._0_4_))));
    auVar54 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar241 * auVar47._12_4_,
                                                 CONCAT48(fVar240 * auVar47._8_4_,
                                                          CONCAT44(fVar239 * auVar47._4_4_,
                                                                   fVar238 * auVar47._0_4_)))),
                              auVar75,ZEXT1632(auVar46));
    auVar55 = vfmadd231ps_fma(auVar91,auVar75,ZEXT1632(auVar49));
    auVar90 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar46));
    auVar76 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar49));
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar90 = vmulps_avx512vl(auVar90,auVar77);
    auVar76 = vmulps_avx512vl(auVar76,auVar77);
    auVar159._0_4_ = fVar243 * auVar90._0_4_;
    auVar159._4_4_ = fVar243 * auVar90._4_4_;
    auVar159._8_4_ = fVar243 * auVar90._8_4_;
    auVar159._12_4_ = fVar243 * auVar90._12_4_;
    auVar159._16_4_ = fVar243 * auVar90._16_4_;
    auVar159._20_4_ = fVar243 * auVar90._20_4_;
    auVar159._24_4_ = fVar243 * auVar90._24_4_;
    auVar159._28_4_ = 0;
    auVar90 = vmulps_avx512vl(auVar224,auVar76);
    auVar47 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar47));
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar47));
    auVar126._0_4_ = auVar159._0_4_ + auVar54._0_4_;
    auVar126._4_4_ = auVar159._4_4_ + auVar54._4_4_;
    auVar126._8_4_ = auVar159._8_4_ + auVar54._8_4_;
    auVar126._12_4_ = auVar159._12_4_ + auVar54._12_4_;
    auVar126._16_4_ = auVar159._16_4_ + 0.0;
    auVar126._20_4_ = auVar159._20_4_ + 0.0;
    auVar126._24_4_ = auVar159._24_4_ + 0.0;
    auVar126._28_4_ = 0;
    auVar94 = ZEXT1632(auVar47);
    auVar79 = vpermt2ps_avx512vl(auVar159,_DAT_0205fd20,auVar94);
    auVar81 = vaddps_avx512vl(ZEXT1632(auVar55),auVar90);
    auVar83 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,auVar94);
    auVar90 = vsubps_avx(auVar76,auVar79);
    auVar79 = vsubps_avx512vl(auVar78,auVar83);
    auVar83 = vmulps_avx512vl(auVar92,auVar95);
    auVar89 = vmulps_avx512vl(auVar85,auVar95);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar75,auVar84);
    auVar91 = vmulps_avx512vl(auVar93,auVar95);
    auVar80 = vmulps_avx512vl(auVar86,auVar95);
    auVar92 = vfmadd231ps_avx512vl(auVar91,auVar75,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar85);
    auVar80 = vmulps_avx512vl(auVar87,auVar95);
    auVar82 = vmulps_avx512vl(auVar88,auVar95);
    auVar46 = vfmadd231ps_fma(auVar80,auVar75,auVar93);
    auVar49 = vfmadd231ps_fma(auVar82,auVar75,auVar86);
    auVar80 = vmulps_avx512vl(auVar95,auVar92);
    auVar82 = vmulps_avx512vl(ZEXT1632(auVar67),auVar91);
    auVar83 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar83);
    auVar89 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar89);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar241 * auVar46._12_4_,
                                            CONCAT48(fVar240 * auVar46._8_4_,
                                                     CONCAT44(fVar239 * auVar46._4_4_,
                                                              fVar238 * auVar46._0_4_)))),auVar75,
                         auVar92);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar241 * auVar49._12_4_,
                                            CONCAT48(fVar240 * auVar49._8_4_,
                                                     CONCAT44(fVar239 * auVar49._4_4_,
                                                              fVar238 * auVar49._0_4_)))),auVar75,
                         auVar91);
    auVar80._4_4_ = fVar239 * auVar92._4_4_;
    auVar80._0_4_ = fVar238 * auVar92._0_4_;
    auVar80._8_4_ = fVar240 * auVar92._8_4_;
    auVar80._12_4_ = fVar241 * auVar92._12_4_;
    auVar80._16_4_ = auVar92._16_4_ * 0.0;
    auVar80._20_4_ = auVar92._20_4_ * 0.0;
    auVar80._24_4_ = auVar92._24_4_ * 0.0;
    auVar80._28_4_ = auVar86._28_4_;
    auVar82._4_4_ = fVar239 * auVar91._4_4_;
    auVar82._0_4_ = fVar238 * auVar91._0_4_;
    auVar82._8_4_ = fVar240 * auVar91._8_4_;
    auVar82._12_4_ = fVar241 * auVar91._12_4_;
    auVar82._16_4_ = auVar91._16_4_ * 0.0;
    auVar82._20_4_ = auVar91._20_4_ * 0.0;
    auVar82._24_4_ = auVar91._24_4_ * 0.0;
    auVar82._28_4_ = auVar93._28_4_;
    auVar93 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar83);
    auVar80 = vfmadd231ps_avx512vl(auVar82,auVar89,auVar75);
    auVar75 = vsubps_avx512vl(auVar92,auVar83);
    auVar92 = vsubps_avx512vl(auVar91,auVar89);
    auVar75 = vmulps_avx512vl(auVar75,auVar77);
    auVar92 = vmulps_avx512vl(auVar92,auVar77);
    fVar227 = fVar243 * auVar75._0_4_;
    fVar238 = fVar243 * auVar75._4_4_;
    auVar84._4_4_ = fVar238;
    auVar84._0_4_ = fVar227;
    fVar239 = fVar243 * auVar75._8_4_;
    auVar84._8_4_ = fVar239;
    fVar240 = fVar243 * auVar75._12_4_;
    auVar84._12_4_ = fVar240;
    fVar241 = fVar243 * auVar75._16_4_;
    auVar84._16_4_ = fVar241;
    fVar242 = fVar243 * auVar75._20_4_;
    auVar84._20_4_ = fVar242;
    fVar243 = fVar243 * auVar75._24_4_;
    auVar84._24_4_ = fVar243;
    auVar84._28_4_ = auVar75._28_4_;
    auVar92 = vmulps_avx512vl(auVar224,auVar92);
    auVar77 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar94);
    auVar83 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar94);
    auVar225._0_4_ = auVar93._0_4_ + fVar227;
    auVar225._4_4_ = auVar93._4_4_ + fVar238;
    auVar225._8_4_ = auVar93._8_4_ + fVar239;
    auVar225._12_4_ = auVar93._12_4_ + fVar240;
    auVar225._16_4_ = auVar93._16_4_ + fVar241;
    auVar225._20_4_ = auVar93._20_4_ + fVar242;
    auVar225._24_4_ = auVar93._24_4_ + fVar243;
    auVar225._28_4_ = auVar93._28_4_ + auVar75._28_4_;
    auVar75 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,ZEXT1632(auVar47));
    auVar89 = vaddps_avx512vl(auVar80,auVar92);
    auVar92 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,ZEXT1632(auVar47));
    auVar75 = vsubps_avx(auVar77,auVar75);
    auVar92 = vsubps_avx512vl(auVar83,auVar92);
    auVar150 = ZEXT1632(auVar54);
    auVar91 = vsubps_avx512vl(auVar93,auVar150);
    auVar159 = ZEXT1632(auVar55);
    auVar82 = vsubps_avx512vl(auVar80,auVar159);
    auVar84 = vsubps_avx512vl(auVar77,auVar76);
    auVar91 = vaddps_avx512vl(auVar91,auVar84);
    auVar84 = vsubps_avx512vl(auVar83,auVar78);
    auVar82 = vaddps_avx512vl(auVar82,auVar84);
    auVar84 = vmulps_avx512vl(auVar159,auVar91);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar150,auVar82);
    auVar85 = vmulps_avx512vl(auVar81,auVar91);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar126,auVar82);
    auVar86 = vmulps_avx512vl(auVar79,auVar91);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar90,auVar82);
    auVar87 = vmulps_avx512vl(auVar78,auVar91);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar76,auVar82);
    auVar88 = vmulps_avx512vl(auVar80,auVar91);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar93,auVar82);
    auVar94 = vmulps_avx512vl(auVar89,auVar91);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar225,auVar82);
    auVar95 = vmulps_avx512vl(auVar92,auVar91);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar75,auVar82);
    auVar91 = vmulps_avx512vl(auVar83,auVar91);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar77,auVar82);
    auVar82 = vminps_avx512vl(auVar84,auVar85);
    auVar84 = vmaxps_avx512vl(auVar84,auVar85);
    auVar85 = vminps_avx512vl(auVar86,auVar87);
    auVar82 = vminps_avx512vl(auVar82,auVar85);
    auVar85 = vmaxps_avx512vl(auVar86,auVar87);
    auVar84 = vmaxps_avx512vl(auVar84,auVar85);
    auVar85 = vminps_avx512vl(auVar88,auVar94);
    auVar86 = vmaxps_avx512vl(auVar88,auVar94);
    auVar87 = vminps_avx512vl(auVar95,auVar91);
    auVar85 = vminps_avx512vl(auVar85,auVar87);
    auVar82 = vminps_avx512vl(auVar82,auVar85);
    auVar91 = vmaxps_avx512vl(auVar95,auVar91);
    auVar91 = vmaxps_avx512vl(auVar86,auVar91);
    auVar91 = vmaxps_avx512vl(auVar84,auVar91);
    uVar21 = vcmpps_avx512vl(auVar82,local_1c0,2);
    uVar22 = vcmpps_avx512vl(auVar91,local_1e0,5);
    uVar39 = 0;
    bVar31 = (byte)uVar21 & (byte)uVar22 & 0x7f;
    if (bVar31 != 0) {
      auVar91 = vsubps_avx512vl(auVar76,auVar150);
      auVar82 = vsubps_avx512vl(auVar78,auVar159);
      auVar84 = vsubps_avx512vl(auVar77,auVar93);
      auVar91 = vaddps_avx512vl(auVar91,auVar84);
      auVar84 = vsubps_avx512vl(auVar83,auVar80);
      auVar82 = vaddps_avx512vl(auVar82,auVar84);
      auVar84 = vmulps_avx512vl(auVar159,auVar91);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar82,auVar150);
      auVar81 = vmulps_avx512vl(auVar81,auVar91);
      auVar81 = vfnmadd213ps_avx512vl(auVar126,auVar82,auVar81);
      auVar79 = vmulps_avx512vl(auVar79,auVar91);
      auVar79 = vfnmadd213ps_avx512vl(auVar90,auVar82,auVar79);
      auVar90 = vmulps_avx512vl(auVar78,auVar91);
      auVar78 = vfnmadd231ps_avx512vl(auVar90,auVar82,auVar76);
      auVar90 = vmulps_avx512vl(auVar80,auVar91);
      auVar93 = vfnmadd231ps_avx512vl(auVar90,auVar82,auVar93);
      auVar90 = vmulps_avx512vl(auVar89,auVar91);
      auVar89 = vfnmadd213ps_avx512vl(auVar225,auVar82,auVar90);
      auVar90 = vmulps_avx512vl(auVar92,auVar91);
      auVar80 = vfnmadd213ps_avx512vl(auVar75,auVar82,auVar90);
      auVar75 = vmulps_avx512vl(auVar83,auVar91);
      auVar77 = vfnmadd231ps_avx512vl(auVar75,auVar77,auVar82);
      auVar90 = vminps_avx(auVar84,auVar81);
      auVar75 = vmaxps_avx(auVar84,auVar81);
      auVar76 = vminps_avx(auVar79,auVar78);
      auVar76 = vminps_avx(auVar90,auVar76);
      auVar90 = vmaxps_avx(auVar79,auVar78);
      auVar75 = vmaxps_avx(auVar75,auVar90);
      auVar92 = vminps_avx(auVar93,auVar89);
      auVar90 = vmaxps_avx(auVar93,auVar89);
      auVar93 = vminps_avx(auVar80,auVar77);
      auVar92 = vminps_avx(auVar92,auVar93);
      auVar92 = vminps_avx(auVar76,auVar92);
      auVar76 = vmaxps_avx(auVar80,auVar77);
      auVar90 = vmaxps_avx(auVar90,auVar76);
      auVar75 = vmaxps_avx(auVar75,auVar90);
      uVar21 = vcmpps_avx512vl(auVar75,local_1e0,5);
      uVar22 = vcmpps_avx512vl(auVar92,local_1c0,2);
      uVar39 = (uint)(bVar31 & (byte)uVar21 & (byte)uVar22);
    }
    if (uVar39 != 0) {
      auStack_440[uVar33] = uVar39;
      uVar21 = vmovlps_avx(auVar44);
      *(undefined8 *)(&uStack_260 + uVar33 * 2) = uVar21;
      uVar1 = vmovlps_avx(auVar56);
      auStack_1a0[uVar33] = uVar1;
      uVar33 = (ulong)((int)uVar33 + 1);
    }
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar280 = ZEXT1664(auVar44);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar281 = ZEXT3264(auVar75);
    do {
      in_ZMM27 = ZEXT464(0x3dcccccd);
      auVar49 = auVar285._0_16_;
      auVar44 = auVar280._0_16_;
      auVar67 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar46 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar33 == 0) {
        if (bVar41) {
          return local_595;
        }
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar109;
        auVar28._0_4_ = uVar109;
        auVar28._8_4_ = uVar109;
        auVar28._12_4_ = uVar109;
        uVar21 = vcmpps_avx512vl(local_3a0,auVar28,2);
        uVar40 = (uint)uVar43 & (uint)uVar43 + 0xf & (uint)uVar21;
        uVar43 = (ulong)uVar40;
        local_595 = uVar40 != 0;
        if (!local_595) {
          return local_595;
        }
        goto LAB_01c9973f;
      }
      uVar32 = (int)uVar33 - 1;
      uVar34 = (ulong)uVar32;
      uVar39 = (&uStack_260)[uVar34 * 2];
      fVar243 = afStack_25c[uVar34 * 2];
      uVar5 = auStack_440[uVar34];
      uVar1 = auStack_1a0[uVar34];
      auVar279 = ZEXT864(uVar1);
      lVar38 = 0;
      for (uVar36 = (ulong)uVar5; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar35 = uVar5 - 1 & uVar5;
      auStack_440[uVar34] = uVar35;
      if (uVar35 == 0) {
        uVar33 = (ulong)uVar32;
      }
      auVar129._0_4_ = (float)lVar38;
      auVar129._4_8_ = SUB128(ZEXT812(0),4);
      auVar129._12_4_ = 0;
      auVar47 = vmulss_avx512f(auVar129,SUB6416(ZEXT464(0x3e124925),0));
      lVar38 = lVar38 + 1;
      auVar53 = vmulss_avx512f(ZEXT416((uint)(float)lVar38),SUB6416(ZEXT464(0x3e124925),0));
      auVar55 = auVar283._0_16_;
      auVar54 = vsubss_avx512f(auVar55,auVar47);
      auVar47 = vmulss_avx512f(ZEXT416((uint)fVar243),auVar47);
      auVar54 = vfmadd231ss_avx512f(auVar47,ZEXT416(uVar39),auVar54);
      auVar47 = vsubss_avx512f(auVar55,auVar53);
      auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * auVar53._0_4_)),ZEXT416(uVar39),auVar47);
      auVar53 = vsubss_avx512f(auVar47,auVar54);
      vucomiss_avx512f(auVar53);
      if (uVar5 == 0 || lVar38 == 0) break;
      auVar277._8_8_ = 0;
      auVar277._0_8_ = uVar1;
      auVar57 = vshufps_avx512vl(auVar277,auVar277,0x50);
      vucomiss_avx512f(auVar53);
      uVar39 = (uint)uVar33;
      auVar130._8_4_ = 0x3f800000;
      auVar130._0_8_ = &DAT_3f8000003f800000;
      auVar130._12_4_ = 0x3f800000;
      auVar56 = vsubps_avx(auVar130,auVar57);
      fVar243 = auVar57._0_4_;
      auVar145._0_4_ = fVar243 * fVar136;
      fVar227 = auVar57._4_4_;
      auVar145._4_4_ = fVar227 * fVar153;
      fVar238 = auVar57._8_4_;
      auVar145._8_4_ = fVar238 * fVar136;
      fVar239 = auVar57._12_4_;
      auVar145._12_4_ = fVar239 * fVar153;
      auVar156._0_4_ = fVar243 * fVar154;
      auVar156._4_4_ = fVar227 * fVar162;
      auVar156._8_4_ = fVar238 * fVar154;
      auVar156._12_4_ = fVar239 * fVar162;
      auVar174._0_4_ = fVar243 * fVar226;
      auVar174._4_4_ = fVar227 * fVar237;
      auVar174._8_4_ = fVar238 * fVar226;
      auVar174._12_4_ = fVar239 * fVar237;
      auVar121._0_4_ = fVar243 * fVar163;
      auVar121._4_4_ = fVar227 * fVar164;
      auVar121._8_4_ = fVar238 * fVar163;
      auVar121._12_4_ = fVar239 * fVar164;
      auVar57 = vfmadd231ps_fma(auVar145,auVar56,auVar45);
      auVar60 = vfmadd231ps_fma(auVar156,auVar56,auVar65);
      auVar61 = vfmadd231ps_fma(auVar174,auVar56,auVar210);
      auVar56 = vfmadd231ps_fma(auVar121,auVar56,auVar220);
      auVar135._16_16_ = auVar57;
      auVar135._0_16_ = auVar57;
      auVar151._16_16_ = auVar60;
      auVar151._0_16_ = auVar60;
      auVar160._16_16_ = auVar61;
      auVar160._0_16_ = auVar61;
      auVar57 = vbroadcastss_avx512vl(auVar54);
      uVar109 = auVar47._0_4_;
      auVar190._20_4_ = uVar109;
      auVar190._16_4_ = uVar109;
      auVar190._24_4_ = uVar109;
      auVar190._28_4_ = uVar109;
      auVar190._0_16_ = auVar57;
      auVar75 = vsubps_avx(auVar151,auVar135);
      auVar57 = vfmadd213ps_fma(auVar75,auVar190,auVar135);
      auVar75 = vsubps_avx(auVar160,auVar151);
      auVar60 = vfmadd213ps_fma(auVar75,auVar190,auVar151);
      auVar56 = vsubps_avx(auVar56,auVar61);
      auVar152._16_16_ = auVar56;
      auVar152._0_16_ = auVar56;
      auVar56 = vfmadd213ps_fma(auVar152,auVar190,auVar160);
      auVar75 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar57));
      auVar57 = vfmadd213ps_fma(auVar75,auVar190,ZEXT1632(auVar57));
      auVar75 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar60));
      auVar56 = vfmadd213ps_fma(auVar75,auVar190,ZEXT1632(auVar60));
      auVar75 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar57));
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar75,auVar190);
      auVar75 = vmulps_avx512vl(auVar75,auVar281._0_32_);
      auVar88._16_16_ = auVar75._16_16_;
      auVar56 = vmulss_avx512f(auVar53,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar243 = auVar56._0_4_;
      auVar175._0_8_ =
           CONCAT44(auVar165._4_4_ + fVar243 * auVar75._4_4_,
                    auVar165._0_4_ + fVar243 * auVar75._0_4_);
      auVar175._8_4_ = auVar165._8_4_ + fVar243 * auVar75._8_4_;
      auVar175._12_4_ = auVar165._12_4_ + fVar243 * auVar75._12_4_;
      auVar146._0_4_ = fVar243 * auVar75._16_4_;
      auVar146._4_4_ = fVar243 * auVar75._20_4_;
      auVar146._8_4_ = fVar243 * auVar75._24_4_;
      auVar146._12_4_ = fVar243 * auVar75._28_4_;
      auVar71 = vsubps_avx((undefined1  [16])0x0,auVar146);
      auVar72 = vshufpd_avx(auVar165,auVar165,3);
      auVar73 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar56 = vsubps_avx(auVar72,auVar165);
      auVar57 = vsubps_avx(auVar73,(undefined1  [16])0x0);
      auVar194._0_4_ = auVar57._0_4_ + auVar56._0_4_;
      auVar194._4_4_ = auVar57._4_4_ + auVar56._4_4_;
      auVar194._8_4_ = auVar57._8_4_ + auVar56._8_4_;
      auVar194._12_4_ = auVar57._12_4_ + auVar56._12_4_;
      auVar56 = vshufps_avx(auVar165,auVar165,0xb1);
      auVar57 = vshufps_avx(auVar175,auVar175,0xb1);
      auVar60 = vshufps_avx(auVar71,auVar71,0xb1);
      auVar61 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar253._4_4_ = auVar194._0_4_;
      auVar253._0_4_ = auVar194._0_4_;
      auVar253._8_4_ = auVar194._0_4_;
      auVar253._12_4_ = auVar194._0_4_;
      auVar62 = vshufps_avx(auVar194,auVar194,0x55);
      fVar243 = auVar62._0_4_;
      auVar211._0_4_ = auVar56._0_4_ * fVar243;
      fVar227 = auVar62._4_4_;
      auVar211._4_4_ = auVar56._4_4_ * fVar227;
      fVar238 = auVar62._8_4_;
      auVar211._8_4_ = auVar56._8_4_ * fVar238;
      fVar239 = auVar62._12_4_;
      auVar211._12_4_ = auVar56._12_4_ * fVar239;
      auVar221._0_4_ = auVar57._0_4_ * fVar243;
      auVar221._4_4_ = auVar57._4_4_ * fVar227;
      auVar221._8_4_ = auVar57._8_4_ * fVar238;
      auVar221._12_4_ = auVar57._12_4_ * fVar239;
      auVar229._0_4_ = auVar60._0_4_ * fVar243;
      auVar229._4_4_ = auVar60._4_4_ * fVar227;
      auVar229._8_4_ = auVar60._8_4_ * fVar238;
      auVar229._12_4_ = auVar60._12_4_ * fVar239;
      auVar195._0_4_ = auVar61._0_4_ * fVar243;
      auVar195._4_4_ = auVar61._4_4_ * fVar227;
      auVar195._8_4_ = auVar61._8_4_ * fVar238;
      auVar195._12_4_ = auVar61._12_4_ * fVar239;
      auVar56 = vfmadd231ps_fma(auVar211,auVar253,auVar165);
      auVar57 = vfmadd231ps_fma(auVar221,auVar253,auVar175);
      auVar62 = vfmadd231ps_fma(auVar229,auVar253,auVar71);
      auVar74 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar253);
      auVar63 = vshufpd_avx(auVar56,auVar56,1);
      auVar68 = vshufpd_avx(auVar57,auVar57,1);
      auVar69 = vshufpd_avx(auVar62,auVar62,1);
      auVar70 = vshufpd_avx(auVar74,auVar74,1);
      auVar60 = vminss_avx(auVar56,auVar57);
      auVar56 = vmaxss_avx(auVar57,auVar56);
      auVar61 = vminss_avx(auVar62,auVar74);
      auVar57 = vmaxss_avx(auVar74,auVar62);
      auVar61 = vminss_avx(auVar60,auVar61);
      auVar56 = vmaxss_avx(auVar57,auVar56);
      auVar62 = vminss_avx(auVar63,auVar68);
      auVar57 = vmaxss_avx(auVar68,auVar63);
      auVar63 = vminss_avx(auVar69,auVar70);
      auVar60 = vmaxss_avx(auVar70,auVar69);
      auVar62 = vminss_avx(auVar62,auVar63);
      auVar57 = vmaxss_avx(auVar60,auVar57);
      vucomiss_avx512f(auVar61);
      if ((uVar39 < 5) || (auVar57 = vucomiss_avx512f(auVar67), uVar39 < 5)) {
        auVar56 = vucomiss_avx512f(auVar67);
        uVar21 = vcmpps_avx512vl(auVar62,auVar46,1);
        uVar22 = vcmpps_avx512vl(auVar61,auVar46,1);
        if ((4 < uVar39 & ((byte)uVar22 | (byte)uVar21)) != 0) goto LAB_01c9aa56;
        uVar21 = vcmpps_avx512vl(auVar67,auVar57,5);
        uVar22 = vcmpps_avx512vl(auVar62,auVar46,5);
        if ((((ushort)uVar22 | (ushort)uVar21) & 1) == 0) goto LAB_01c9aa56;
        bVar23 = true;
      }
      else {
LAB_01c9aa56:
        auVar278._8_8_ = 0;
        auVar278._0_8_ = uVar1;
        uVar21 = vcmpss_avx512f(auVar61,auVar49,1);
        bVar23 = (bool)((byte)uVar21 & 1);
        iVar107 = auVar283._0_4_;
        fVar243 = (float)((uint)bVar23 * -0x40800000 + (uint)!bVar23 * iVar107);
        uVar21 = vcmpss_avx512f(auVar56,auVar49,1);
        bVar23 = (bool)((byte)uVar21 & 1);
        fVar227 = (float)((uint)bVar23 * -0x40800000 + (uint)!bVar23 * iVar107);
        bVar23 = fVar243 != fVar227;
        iVar284 = auVar285._0_4_;
        auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar96._4_28_ = auVar88._4_28_;
        auVar96._0_4_ = (uint)bVar23 * iVar284 + (uint)!bVar23 * 0x7f800000;
        auVar46 = auVar96._0_16_;
        auVar98._16_16_ = auVar88._16_16_;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar23 * iVar284 + (uint)!bVar23 * -0x800000;
        auVar67 = auVar97._0_16_;
        uVar21 = vcmpss_avx512f(auVar62,auVar49,1);
        bVar23 = (bool)((byte)uVar21 & 1);
        fVar238 = (float)((uint)bVar23 * -0x40800000 + (uint)!bVar23 * iVar107);
        if ((fVar243 != fVar238) || (NAN(fVar243) || NAN(fVar238))) {
          fVar239 = auVar62._0_4_;
          fVar243 = auVar61._0_4_;
          bVar23 = fVar239 == fVar243;
          if ((!bVar23) || (NAN(fVar239) || NAN(fVar243))) {
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar60 = vxorps_avx512vl(auVar61,auVar27);
            auVar269._0_4_ = auVar60._0_4_ / (fVar239 - fVar243);
            auVar269._4_12_ = auVar60._4_12_;
            auVar60 = vsubss_avx512f(auVar55,auVar269);
            auVar61 = vfmadd213ss_avx512f(auVar60,auVar49,auVar269);
            auVar60 = auVar61;
          }
          else {
            vucomiss_avx512f(auVar49);
            auVar100._16_16_ = auVar88._16_16_;
            auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar23 * iVar284 + (uint)!bVar23 * 0x7f800000;
            auVar61 = auVar99._0_16_;
            auVar60 = ZEXT416((uint)bVar23 * 0x3f800000 + (uint)!bVar23 * -0x800000);
          }
          auVar46 = vminss_avx(auVar46,auVar61);
          auVar67 = vmaxss_avx(auVar60,auVar67);
        }
        uVar21 = vcmpss_avx512f(auVar57,auVar49,1);
        bVar23 = (bool)((byte)uVar21 & 1);
        fVar243 = (float)((uint)bVar23 * -0x40800000 + (uint)!bVar23 * iVar107);
        if ((fVar227 != fVar243) || (NAN(fVar227) || NAN(fVar243))) {
          fVar239 = auVar57._0_4_;
          fVar227 = auVar56._0_4_;
          bVar23 = fVar239 == fVar227;
          if ((!bVar23) || (NAN(fVar239) || NAN(fVar227))) {
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar56 = vxorps_avx512vl(auVar56,auVar26);
            auVar230._0_4_ = auVar56._0_4_ / (fVar239 - fVar227);
            auVar230._4_12_ = auVar56._4_12_;
            auVar56 = vsubss_avx512f(auVar55,auVar230);
            auVar57 = vfmadd213ss_avx512f(auVar56,auVar49,auVar230);
            auVar56 = auVar57;
          }
          else {
            vucomiss_avx512f(auVar49);
            auVar102._16_16_ = auVar88._16_16_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar23 * iVar284 + (uint)!bVar23 * 0x7f800000;
            auVar57 = auVar101._0_16_;
            auVar56 = ZEXT416((uint)bVar23 * 0x3f800000 + (uint)!bVar23 * -0x800000);
          }
          auVar46 = vminss_avx(auVar46,auVar57);
          auVar67 = vmaxss_avx(auVar56,auVar67);
        }
        bVar23 = fVar238 != fVar243;
        auVar56 = vminss_avx512f(auVar46,auVar55);
        auVar104._16_16_ = auVar88._16_16_;
        auVar104._0_16_ = auVar46;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar23 * auVar56._0_4_ + (uint)!bVar23 * auVar46._0_4_;
        auVar46 = vmaxss_avx512f(auVar55,auVar67);
        auVar106._16_16_ = auVar88._16_16_;
        auVar106._0_16_ = auVar67;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar23 * auVar46._0_4_ + (uint)!bVar23 * auVar67._0_4_;
        auVar67 = vmaxss_avx512f(auVar49,auVar103._0_16_);
        auVar46 = vminss_avx512f(auVar105._0_16_,auVar55);
        bVar23 = true;
        if (auVar46._0_4_ < auVar67._0_4_) {
          auVar279 = ZEXT1664(auVar278);
        }
        else {
          auVar46 = vaddss_avx512f(auVar46,in_ZMM27._0_16_);
          auVar68 = vmaxss_avx512f(auVar49,ZEXT416((uint)(auVar67._0_4_ + -0.1)));
          auVar69 = vminss_avx512f(auVar46,auVar55);
          auVar122._0_8_ = auVar165._0_8_;
          auVar122._8_8_ = auVar122._0_8_;
          auVar222._8_8_ = auVar175._0_8_;
          auVar222._0_8_ = auVar175._0_8_;
          auVar231._8_8_ = auVar71._0_8_;
          auVar231._0_8_ = auVar71._0_8_;
          auVar67 = vshufpd_avx(auVar175,auVar175,3);
          auVar46 = vshufpd_avx(auVar71,auVar71,3);
          auVar56 = vshufps_avx(auVar68,auVar69,0);
          auVar254._8_4_ = 0x3f800000;
          auVar254._0_8_ = &DAT_3f8000003f800000;
          auVar254._12_4_ = 0x3f800000;
          auVar57 = vsubps_avx(auVar254,auVar56);
          fVar243 = auVar56._0_4_;
          auVar263._0_4_ = fVar243 * auVar72._0_4_;
          fVar227 = auVar56._4_4_;
          auVar263._4_4_ = fVar227 * auVar72._4_4_;
          fVar238 = auVar56._8_4_;
          auVar263._8_4_ = fVar238 * auVar72._8_4_;
          fVar239 = auVar56._12_4_;
          auVar263._12_4_ = fVar239 * auVar72._12_4_;
          auVar176._0_4_ = fVar243 * auVar67._0_4_;
          auVar176._4_4_ = fVar227 * auVar67._4_4_;
          auVar176._8_4_ = fVar238 * auVar67._8_4_;
          auVar176._12_4_ = fVar239 * auVar67._12_4_;
          auVar187._0_4_ = fVar243 * auVar46._0_4_;
          auVar187._4_4_ = fVar227 * auVar46._4_4_;
          auVar187._8_4_ = fVar238 * auVar46._8_4_;
          auVar187._12_4_ = fVar239 * auVar46._12_4_;
          auVar147._0_4_ = fVar243 * auVar73._0_4_;
          auVar147._4_4_ = fVar227 * auVar73._4_4_;
          auVar147._8_4_ = fVar238 * auVar73._8_4_;
          auVar147._12_4_ = fVar239 * auVar73._12_4_;
          auVar60 = vfmadd231ps_fma(auVar263,auVar57,auVar122);
          auVar61 = vfmadd231ps_fma(auVar176,auVar57,auVar222);
          auVar62 = vfmadd231ps_fma(auVar187,auVar57,auVar231);
          auVar63 = vfmadd231ps_fma(auVar147,auVar57,ZEXT816(0));
          auVar67 = vsubss_avx512f(auVar55,auVar68);
          auVar46 = vmovshdup_avx512vl(auVar278);
          auVar70 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar68._0_4_)),auVar278,
                                        auVar67);
          auVar67 = vsubss_avx512f(auVar55,auVar69);
          auVar71 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar69._0_4_ * auVar46._0_4_)),auVar278,
                                        auVar67);
          auVar57 = vdivss_avx512f(auVar55,auVar53);
          auVar67 = vsubps_avx(auVar61,auVar60);
          auVar53 = vmulps_avx512vl(auVar67,auVar44);
          auVar67 = vsubps_avx(auVar62,auVar61);
          auVar56 = vmulps_avx512vl(auVar67,auVar44);
          auVar67 = vsubps_avx(auVar63,auVar62);
          auVar67 = vmulps_avx512vl(auVar67,auVar44);
          auVar46 = vminps_avx(auVar56,auVar67);
          auVar67 = vmaxps_avx(auVar56,auVar67);
          auVar46 = vminps_avx(auVar53,auVar46);
          auVar67 = vmaxps_avx(auVar53,auVar67);
          auVar53 = vshufpd_avx(auVar46,auVar46,3);
          auVar56 = vshufpd_avx(auVar67,auVar67,3);
          auVar46 = vminps_avx(auVar46,auVar53);
          auVar67 = vmaxps_avx(auVar67,auVar56);
          fVar243 = auVar57._0_4_;
          auVar212._0_4_ = fVar243 * auVar46._0_4_;
          auVar212._4_4_ = fVar243 * auVar46._4_4_;
          auVar212._8_4_ = fVar243 * auVar46._8_4_;
          auVar212._12_4_ = fVar243 * auVar46._12_4_;
          auVar196._0_4_ = fVar243 * auVar67._0_4_;
          auVar196._4_4_ = fVar243 * auVar67._4_4_;
          auVar196._8_4_ = fVar243 * auVar67._8_4_;
          auVar196._12_4_ = fVar243 * auVar67._12_4_;
          auVar72 = vdivss_avx512f(auVar55,ZEXT416((uint)(auVar71._0_4_ - auVar70._0_4_)));
          auVar67 = vshufpd_avx(auVar60,auVar60,3);
          auVar46 = vshufpd_avx(auVar61,auVar61,3);
          auVar53 = vshufpd_avx(auVar62,auVar62,3);
          auVar56 = vshufpd_avx(auVar63,auVar63,3);
          auVar67 = vsubps_avx(auVar67,auVar60);
          auVar57 = vsubps_avx(auVar46,auVar61);
          auVar60 = vsubps_avx(auVar53,auVar62);
          auVar56 = vsubps_avx(auVar56,auVar63);
          auVar46 = vminps_avx(auVar67,auVar57);
          auVar67 = vmaxps_avx(auVar67,auVar57);
          auVar53 = vminps_avx(auVar60,auVar56);
          auVar53 = vminps_avx(auVar46,auVar53);
          auVar46 = vmaxps_avx(auVar60,auVar56);
          auVar67 = vmaxps_avx(auVar67,auVar46);
          fVar243 = auVar72._0_4_;
          auVar232._0_4_ = fVar243 * auVar53._0_4_;
          auVar232._4_4_ = fVar243 * auVar53._4_4_;
          auVar232._8_4_ = fVar243 * auVar53._8_4_;
          auVar232._12_4_ = fVar243 * auVar53._12_4_;
          auVar246._0_4_ = fVar243 * auVar67._0_4_;
          auVar246._4_4_ = fVar243 * auVar67._4_4_;
          auVar246._8_4_ = fVar243 * auVar67._8_4_;
          auVar246._12_4_ = fVar243 * auVar67._12_4_;
          auVar69 = vinsertps_avx512f(auVar54,auVar70,0x10);
          auVar57 = vinsertps_avx(auVar47,auVar71,0x10);
          auVar112._0_4_ = auVar69._0_4_ + auVar57._0_4_;
          auVar112._4_4_ = auVar69._4_4_ + auVar57._4_4_;
          auVar112._8_4_ = auVar69._8_4_ + auVar57._8_4_;
          auVar112._12_4_ = auVar69._12_4_ + auVar57._12_4_;
          auVar25._8_4_ = 0x3f000000;
          auVar25._0_8_ = 0x3f0000003f000000;
          auVar25._12_4_ = 0x3f000000;
          auVar73 = vmulps_avx512vl(auVar112,auVar25);
          auVar53 = vshufps_avx(auVar73,auVar73,0x54);
          uVar109 = auVar73._0_4_;
          auVar131._4_4_ = uVar109;
          auVar131._0_4_ = uVar109;
          auVar131._8_4_ = uVar109;
          auVar131._12_4_ = uVar109;
          auVar56 = vfmadd213ps_avx512vl(local_270,auVar131,auVar66);
          auVar46 = vfmadd213ps_fma(local_280,auVar131,auVar58);
          auVar60 = vfmadd213ps_avx512vl(local_290,auVar131,auVar59);
          auVar67 = vsubps_avx(auVar46,auVar56);
          auVar56 = vfmadd213ps_fma(auVar67,auVar131,auVar56);
          auVar67 = vsubps_avx(auVar60,auVar46);
          auVar67 = vfmadd213ps_fma(auVar67,auVar131,auVar46);
          auVar67 = vsubps_avx(auVar67,auVar56);
          auVar46 = vfmadd231ps_fma(auVar56,auVar67,auVar131);
          auVar61 = vmulps_avx512vl(auVar67,auVar44);
          auVar255._8_8_ = auVar46._0_8_;
          auVar255._0_8_ = auVar46._0_8_;
          auVar67 = vshufpd_avx(auVar46,auVar46,3);
          auVar46 = vshufps_avx(auVar73,auVar73,0x55);
          auVar56 = vsubps_avx(auVar67,auVar255);
          auVar60 = vfmadd231ps_fma(auVar255,auVar46,auVar56);
          auVar270._8_8_ = auVar61._0_8_;
          auVar270._0_8_ = auVar61._0_8_;
          auVar67 = vshufpd_avx(auVar61,auVar61,3);
          auVar67 = vsubps_avx(auVar67,auVar270);
          auVar46 = vfmadd213ps_fma(auVar67,auVar46,auVar270);
          auVar132._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
          auVar132._8_4_ = auVar56._8_4_ ^ 0x80000000;
          auVar132._12_4_ = auVar56._12_4_ ^ 0x80000000;
          auVar67 = vmovshdup_avx(auVar46);
          auVar271._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar271._8_4_ = auVar67._8_4_ ^ 0x80000000;
          auVar271._12_4_ = auVar67._12_4_ ^ 0x80000000;
          auVar61 = vmovshdup_avx512vl(auVar56);
          auVar62 = vpermt2ps_avx512vl(auVar271,ZEXT416(5),auVar56);
          auVar67 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar67._0_4_ * auVar56._0_4_)),auVar46,
                                        auVar61);
          auVar46 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar132);
          auVar148._0_4_ = auVar67._0_4_;
          auVar148._4_4_ = auVar148._0_4_;
          auVar148._8_4_ = auVar148._0_4_;
          auVar148._12_4_ = auVar148._0_4_;
          auVar67 = vdivps_avx(auVar62,auVar148);
          auVar46 = vdivps_avx(auVar46,auVar148);
          fVar227 = auVar60._0_4_;
          auVar56 = vshufps_avx(auVar60,auVar60,0x55);
          fVar243 = auVar46._0_4_;
          auVar256._0_4_ = fVar227 * auVar67._0_4_ + auVar56._0_4_ * fVar243;
          auVar256._4_4_ = fVar227 * auVar67._4_4_ + auVar56._4_4_ * auVar46._4_4_;
          auVar256._8_4_ = fVar227 * auVar67._8_4_ + auVar56._8_4_ * auVar46._8_4_;
          auVar256._12_4_ = fVar227 * auVar67._12_4_ + auVar56._12_4_ * auVar46._12_4_;
          auVar68 = vsubps_avx(auVar53,auVar256);
          auVar60 = vmovshdup_avx(auVar67);
          auVar53 = vinsertps_avx(auVar212,auVar232,0x1c);
          auVar272._0_4_ = auVar60._0_4_ * auVar53._0_4_;
          auVar272._4_4_ = auVar60._4_4_ * auVar53._4_4_;
          auVar272._8_4_ = auVar60._8_4_ * auVar53._8_4_;
          auVar272._12_4_ = auVar60._12_4_ * auVar53._12_4_;
          auVar56 = vinsertps_avx(auVar196,auVar246,0x1c);
          auVar257._0_4_ = auVar60._0_4_ * auVar56._0_4_;
          auVar257._4_4_ = auVar60._4_4_ * auVar56._4_4_;
          auVar257._8_4_ = auVar60._8_4_ * auVar56._8_4_;
          auVar257._12_4_ = auVar60._12_4_ * auVar56._12_4_;
          auVar72 = vminps_avx512vl(auVar272,auVar257);
          auVar62 = vmaxps_avx(auVar257,auVar272);
          auVar63 = vmovshdup_avx(auVar46);
          auVar60 = vinsertps_avx(auVar232,auVar212,0x4c);
          auVar233._0_4_ = auVar63._0_4_ * auVar60._0_4_;
          auVar233._4_4_ = auVar63._4_4_ * auVar60._4_4_;
          auVar233._8_4_ = auVar63._8_4_ * auVar60._8_4_;
          auVar233._12_4_ = auVar63._12_4_ * auVar60._12_4_;
          auVar61 = vinsertps_avx(auVar246,auVar196,0x4c);
          auVar247._0_4_ = auVar63._0_4_ * auVar61._0_4_;
          auVar247._4_4_ = auVar63._4_4_ * auVar61._4_4_;
          auVar247._8_4_ = auVar63._8_4_ * auVar61._8_4_;
          auVar247._12_4_ = auVar63._12_4_ * auVar61._12_4_;
          auVar63 = vminps_avx(auVar233,auVar247);
          auVar72 = vaddps_avx512vl(auVar72,auVar63);
          auVar63 = vmaxps_avx(auVar247,auVar233);
          auVar234._0_4_ = auVar62._0_4_ + auVar63._0_4_;
          auVar234._4_4_ = auVar62._4_4_ + auVar63._4_4_;
          auVar234._8_4_ = auVar62._8_4_ + auVar63._8_4_;
          auVar234._12_4_ = auVar62._12_4_ + auVar63._12_4_;
          auVar248._8_8_ = 0x3f80000000000000;
          auVar248._0_8_ = 0x3f80000000000000;
          auVar62 = vsubps_avx(auVar248,auVar234);
          auVar63 = vsubps_avx(auVar248,auVar72);
          auVar72 = vsubps_avx(auVar69,auVar73);
          auVar73 = vsubps_avx(auVar57,auVar73);
          fVar241 = auVar72._0_4_;
          auVar273._0_4_ = fVar241 * auVar62._0_4_;
          fVar242 = auVar72._4_4_;
          auVar273._4_4_ = fVar242 * auVar62._4_4_;
          fVar204 = auVar72._8_4_;
          auVar273._8_4_ = fVar204 * auVar62._8_4_;
          fVar205 = auVar72._12_4_;
          auVar273._12_4_ = fVar205 * auVar62._12_4_;
          auVar74 = vbroadcastss_avx512vl(auVar67);
          auVar53 = vmulps_avx512vl(auVar74,auVar53);
          auVar56 = vmulps_avx512vl(auVar74,auVar56);
          auVar74 = vminps_avx512vl(auVar53,auVar56);
          auVar53 = vmaxps_avx(auVar56,auVar53);
          auVar213._0_4_ = fVar243 * auVar60._0_4_;
          auVar213._4_4_ = fVar243 * auVar60._4_4_;
          auVar213._8_4_ = fVar243 * auVar60._8_4_;
          auVar213._12_4_ = fVar243 * auVar60._12_4_;
          auVar197._0_4_ = fVar243 * auVar61._0_4_;
          auVar197._4_4_ = fVar243 * auVar61._4_4_;
          auVar197._8_4_ = fVar243 * auVar61._8_4_;
          auVar197._12_4_ = fVar243 * auVar61._12_4_;
          auVar56 = vminps_avx(auVar213,auVar197);
          auVar60 = vaddps_avx512vl(auVar74,auVar56);
          auVar61 = vmulps_avx512vl(auVar72,auVar63);
          fVar227 = auVar73._0_4_;
          auVar235._0_4_ = fVar227 * auVar62._0_4_;
          fVar238 = auVar73._4_4_;
          auVar235._4_4_ = fVar238 * auVar62._4_4_;
          fVar239 = auVar73._8_4_;
          auVar235._8_4_ = fVar239 * auVar62._8_4_;
          fVar240 = auVar73._12_4_;
          auVar235._12_4_ = fVar240 * auVar62._12_4_;
          auVar249._0_4_ = fVar227 * auVar63._0_4_;
          auVar249._4_4_ = fVar238 * auVar63._4_4_;
          auVar249._8_4_ = fVar239 * auVar63._8_4_;
          auVar249._12_4_ = fVar240 * auVar63._12_4_;
          auVar56 = vmaxps_avx(auVar197,auVar213);
          auVar198._0_4_ = auVar53._0_4_ + auVar56._0_4_;
          auVar198._4_4_ = auVar53._4_4_ + auVar56._4_4_;
          auVar198._8_4_ = auVar53._8_4_ + auVar56._8_4_;
          auVar198._12_4_ = auVar53._12_4_ + auVar56._12_4_;
          auVar214._8_8_ = 0x3f800000;
          auVar214._0_8_ = 0x3f800000;
          auVar53 = vsubps_avx(auVar214,auVar198);
          auVar56 = vsubps_avx(auVar214,auVar60);
          auVar264._0_4_ = fVar241 * auVar53._0_4_;
          auVar264._4_4_ = fVar242 * auVar53._4_4_;
          auVar264._8_4_ = fVar204 * auVar53._8_4_;
          auVar264._12_4_ = fVar205 * auVar53._12_4_;
          auVar258._0_4_ = fVar241 * auVar56._0_4_;
          auVar258._4_4_ = fVar242 * auVar56._4_4_;
          auVar258._8_4_ = fVar204 * auVar56._8_4_;
          auVar258._12_4_ = fVar205 * auVar56._12_4_;
          auVar199._0_4_ = fVar227 * auVar53._0_4_;
          auVar199._4_4_ = fVar238 * auVar53._4_4_;
          auVar199._8_4_ = fVar239 * auVar53._8_4_;
          auVar199._12_4_ = fVar240 * auVar53._12_4_;
          auVar215._0_4_ = fVar227 * auVar56._0_4_;
          auVar215._4_4_ = fVar238 * auVar56._4_4_;
          auVar215._8_4_ = fVar239 * auVar56._8_4_;
          auVar215._12_4_ = fVar240 * auVar56._12_4_;
          auVar53 = vminps_avx(auVar264,auVar258);
          auVar56 = vminps_avx(auVar199,auVar215);
          auVar60 = vminps_avx(auVar53,auVar56);
          auVar53 = vmaxps_avx(auVar258,auVar264);
          auVar56 = vmaxps_avx(auVar215,auVar199);
          auVar56 = vmaxps_avx(auVar56,auVar53);
          auVar62 = vminps_avx512vl(auVar273,auVar61);
          auVar53 = vminps_avx(auVar235,auVar249);
          auVar53 = vminps_avx(auVar62,auVar53);
          auVar53 = vhaddps_avx(auVar60,auVar53);
          auVar61 = vmaxps_avx512vl(auVar61,auVar273);
          auVar60 = vmaxps_avx(auVar249,auVar235);
          auVar60 = vmaxps_avx(auVar60,auVar61);
          auVar56 = vhaddps_avx(auVar56,auVar60);
          auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
          auVar56 = vshufps_avx(auVar56,auVar56,0xe8);
          auVar200._0_4_ = auVar53._0_4_ + auVar68._0_4_;
          auVar200._4_4_ = auVar53._4_4_ + auVar68._4_4_;
          auVar200._8_4_ = auVar53._8_4_ + auVar68._8_4_;
          auVar200._12_4_ = auVar53._12_4_ + auVar68._12_4_;
          auVar216._0_4_ = auVar56._0_4_ + auVar68._0_4_;
          auVar216._4_4_ = auVar56._4_4_ + auVar68._4_4_;
          auVar216._8_4_ = auVar56._8_4_ + auVar68._8_4_;
          auVar216._12_4_ = auVar56._12_4_ + auVar68._12_4_;
          auVar53 = vmaxps_avx(auVar69,auVar200);
          auVar56 = vminps_avx(auVar216,auVar57);
          uVar1 = vcmpps_avx512vl(auVar56,auVar53,1);
          auVar53 = vinsertps_avx512f(auVar70,auVar71,0x10);
          auVar279 = ZEXT1664(auVar53);
          if ((uVar1 & 3) == 0) {
            vucomiss_avx512f(auVar54);
            local_4d0 = auVar64._0_4_;
            fStack_4cc = auVar64._4_4_;
            fStack_4c8 = auVar64._8_4_;
            fStack_4c4 = auVar64._12_4_;
            if (uVar39 < 4 && (uVar5 == 0 || lVar38 == 0)) {
              bVar23 = false;
            }
            else {
              lVar38 = 200;
              do {
                auVar56 = vsubss_avx512f(auVar55,auVar68);
                fVar239 = auVar56._0_4_;
                fVar227 = fVar239 * fVar239 * fVar239;
                fVar240 = auVar68._0_4_;
                fVar238 = fVar240 * 3.0 * fVar239 * fVar239;
                fVar239 = fVar239 * fVar240 * fVar240 * 3.0;
                auVar177._4_4_ = fVar227;
                auVar177._0_4_ = fVar227;
                auVar177._8_4_ = fVar227;
                auVar177._12_4_ = fVar227;
                auVar157._4_4_ = fVar238;
                auVar157._0_4_ = fVar238;
                auVar157._8_4_ = fVar238;
                auVar157._12_4_ = fVar238;
                auVar123._4_4_ = fVar239;
                auVar123._0_4_ = fVar239;
                auVar123._8_4_ = fVar239;
                auVar123._12_4_ = fVar239;
                fVar240 = fVar240 * fVar240 * fVar240;
                auVar188._0_4_ = local_4d0 * fVar240;
                auVar188._4_4_ = fStack_4cc * fVar240;
                auVar188._8_4_ = fStack_4c8 * fVar240;
                auVar188._12_4_ = fStack_4c4 * fVar240;
                auVar56 = vfmadd231ps_fma(auVar188,auVar59,auVar123);
                auVar56 = vfmadd231ps_fma(auVar56,auVar58,auVar157);
                auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar177);
                auVar124._8_8_ = auVar56._0_8_;
                auVar124._0_8_ = auVar56._0_8_;
                auVar56 = vshufpd_avx(auVar56,auVar56,3);
                auVar57 = vshufps_avx(auVar68,auVar68,0x55);
                auVar56 = vsubps_avx(auVar56,auVar124);
                auVar57 = vfmadd213ps_fma(auVar56,auVar57,auVar124);
                fVar227 = auVar57._0_4_;
                auVar56 = vshufps_avx(auVar57,auVar57,0x55);
                auVar125._0_4_ = auVar67._0_4_ * fVar227 + fVar243 * auVar56._0_4_;
                auVar125._4_4_ = auVar67._4_4_ * fVar227 + auVar46._4_4_ * auVar56._4_4_;
                auVar125._8_4_ = auVar67._8_4_ * fVar227 + auVar46._8_4_ * auVar56._8_4_;
                auVar125._12_4_ = auVar67._12_4_ * fVar227 + auVar46._12_4_ * auVar56._12_4_;
                auVar68 = vsubps_avx(auVar68,auVar125);
                auVar56 = vandps_avx512vl(auVar57,auVar282._0_16_);
                auVar57 = vprolq_avx512vl(auVar56,0x20);
                auVar56 = vmaxss_avx(auVar57,auVar56);
                bVar42 = auVar56._0_4_ <= fVar113;
                if (auVar56._0_4_ < fVar113) {
                  auVar67 = vucomiss_avx512f(auVar49);
                  if (bVar42) {
                    auVar46 = vucomiss_avx512f(auVar67);
                    auVar283 = ZEXT1664(auVar46);
                    if (bVar42) {
                      vmovshdup_avx(auVar67);
                      auVar46 = vucomiss_avx512f(auVar49);
                      if (bVar42) {
                        auVar55 = vucomiss_avx512f(auVar46);
                        auVar283 = ZEXT1664(auVar55);
                        if (bVar42) {
                          auVar56 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar73 = vinsertps_avx(auVar56,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar56 = vdpps_avx(auVar73,local_2a0,0x7f);
                          auVar57 = vdpps_avx(auVar73,local_2b0,0x7f);
                          auVar60 = vdpps_avx(auVar73,local_2c0,0x7f);
                          auVar61 = vdpps_avx(auVar73,local_2d0,0x7f);
                          auVar62 = vdpps_avx(auVar73,local_2e0,0x7f);
                          auVar63 = vdpps_avx(auVar73,local_2f0,0x7f);
                          auVar72 = vdpps_avx(auVar73,local_300,0x7f);
                          auVar73 = vdpps_avx(auVar73,local_310,0x7f);
                          auVar68 = vsubss_avx512f(auVar55,auVar46);
                          fVar243 = auVar46._0_4_;
                          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * auVar62._0_4_)),auVar68
                                                    ,auVar56);
                          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar243)),auVar68
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar243)),auVar68
                                                    ,auVar60);
                          auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * auVar73._0_4_)),auVar68
                                                    ,auVar61);
                          auVar55 = vsubss_avx512f(auVar55,auVar67);
                          auVar189._0_4_ = auVar55._0_4_;
                          fVar243 = auVar189._0_4_ * auVar189._0_4_ * auVar189._0_4_;
                          local_120 = auVar67._0_4_;
                          fVar227 = local_120 * 3.0 * auVar189._0_4_ * auVar189._0_4_;
                          fVar238 = auVar189._0_4_ * local_120 * local_120 * 3.0;
                          fVar240 = local_120 * local_120 * local_120;
                          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar60._0_4_)),
                                                    ZEXT416((uint)fVar238),auVar57);
                          auVar55 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar227),auVar56);
                          auVar46 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar243),auVar46);
                          fVar239 = auVar46._0_4_;
                          if ((fVar108 <= fVar239) &&
                             (fVar241 = *(float *)(ray + k * 4 + 0x100), fVar239 <= fVar241)) {
                            auVar46 = vshufps_avx(auVar67,auVar67,0x55);
                            auVar217._8_4_ = 0x3f800000;
                            auVar217._0_8_ = &DAT_3f8000003f800000;
                            auVar217._12_4_ = 0x3f800000;
                            auVar55 = vsubps_avx(auVar217,auVar46);
                            fVar242 = auVar46._0_4_;
                            auVar223._0_4_ = fVar242 * (float)local_360._0_4_;
                            fVar204 = auVar46._4_4_;
                            auVar223._4_4_ = fVar204 * (float)local_360._4_4_;
                            fVar205 = auVar46._8_4_;
                            auVar223._8_4_ = fVar205 * fStack_358;
                            fVar206 = auVar46._12_4_;
                            auVar223._12_4_ = fVar206 * fStack_354;
                            auVar236._0_4_ = fVar242 * (float)local_370._0_4_;
                            auVar236._4_4_ = fVar204 * (float)local_370._4_4_;
                            auVar236._8_4_ = fVar205 * fStack_368;
                            auVar236._12_4_ = fVar206 * fStack_364;
                            auVar250._0_4_ = fVar242 * (float)local_380._0_4_;
                            auVar250._4_4_ = fVar204 * (float)local_380._4_4_;
                            auVar250._8_4_ = fVar205 * fStack_378;
                            auVar250._12_4_ = fVar206 * fStack_374;
                            auVar201._0_4_ = fVar242 * (float)local_390._0_4_;
                            auVar201._4_4_ = fVar204 * (float)local_390._4_4_;
                            auVar201._8_4_ = fVar205 * fStack_388;
                            auVar201._12_4_ = fVar206 * fStack_384;
                            auVar46 = vfmadd231ps_fma(auVar223,auVar55,local_320);
                            auVar56 = vfmadd231ps_fma(auVar236,auVar55,local_330);
                            auVar57 = vfmadd231ps_fma(auVar250,auVar55,local_340);
                            auVar60 = vfmadd231ps_fma(auVar201,auVar55,local_350);
                            auVar46 = vsubps_avx(auVar56,auVar46);
                            auVar55 = vsubps_avx(auVar57,auVar56);
                            auVar56 = vsubps_avx(auVar60,auVar57);
                            auVar251._0_4_ = local_120 * auVar55._0_4_;
                            auVar251._4_4_ = local_120 * auVar55._4_4_;
                            auVar251._8_4_ = local_120 * auVar55._8_4_;
                            auVar251._12_4_ = local_120 * auVar55._12_4_;
                            auVar189._4_4_ = auVar189._0_4_;
                            auVar189._8_4_ = auVar189._0_4_;
                            auVar189._12_4_ = auVar189._0_4_;
                            auVar46 = vfmadd231ps_fma(auVar251,auVar189,auVar46);
                            auVar202._0_4_ = local_120 * auVar56._0_4_;
                            auVar202._4_4_ = local_120 * auVar56._4_4_;
                            auVar202._8_4_ = local_120 * auVar56._8_4_;
                            auVar202._12_4_ = local_120 * auVar56._12_4_;
                            auVar55 = vfmadd231ps_fma(auVar202,auVar189,auVar55);
                            auVar203._0_4_ = local_120 * auVar55._0_4_;
                            auVar203._4_4_ = local_120 * auVar55._4_4_;
                            auVar203._8_4_ = local_120 * auVar55._8_4_;
                            auVar203._12_4_ = local_120 * auVar55._12_4_;
                            auVar46 = vfmadd231ps_fma(auVar203,auVar189,auVar46);
                            auVar44 = vmulps_avx512vl(auVar46,auVar44);
                            pGVar6 = (context->scene->geometries).items[uVar40].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar42 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar42 = true,
                                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar178._0_4_ = fVar240 * (float)local_3e0._0_4_;
                              auVar178._4_4_ = fVar240 * (float)local_3e0._4_4_;
                              auVar178._8_4_ = fVar240 * fStack_3d8;
                              auVar178._12_4_ = fVar240 * fStack_3d4;
                              auVar158._4_4_ = fVar238;
                              auVar158._0_4_ = fVar238;
                              auVar158._8_4_ = fVar238;
                              auVar158._12_4_ = fVar238;
                              auVar46 = vfmadd132ps_fma(auVar158,auVar178,local_3d0);
                              auVar149._4_4_ = fVar227;
                              auVar149._0_4_ = fVar227;
                              auVar149._8_4_ = fVar227;
                              auVar149._12_4_ = fVar227;
                              auVar46 = vfmadd132ps_fma(auVar149,auVar46,local_3c0);
                              auVar133._4_4_ = fVar243;
                              auVar133._0_4_ = fVar243;
                              auVar133._8_4_ = fVar243;
                              auVar133._12_4_ = fVar243;
                              auVar56 = vfmadd132ps_fma(auVar133,auVar46,local_3b0);
                              auVar46 = vshufps_avx(auVar56,auVar56,0xc9);
                              auVar55 = vshufps_avx(auVar44,auVar44,0xc9);
                              auVar134._0_4_ = auVar56._0_4_ * auVar55._0_4_;
                              auVar134._4_4_ = auVar56._4_4_ * auVar55._4_4_;
                              auVar134._8_4_ = auVar56._8_4_ * auVar55._8_4_;
                              auVar134._12_4_ = auVar56._12_4_ * auVar55._12_4_;
                              auVar44 = vfmsub231ps_fma(auVar134,auVar44,auVar46);
                              auVar161._8_4_ = 1;
                              auVar161._0_8_ = 0x100000001;
                              auVar161._12_4_ = 1;
                              auVar161._16_4_ = 1;
                              auVar161._20_4_ = 1;
                              auVar161._24_4_ = 1;
                              auVar161._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar161,ZEXT1632(auVar67));
                              auVar75 = vpermps_avx2(auVar161,ZEXT1632(auVar44));
                              auVar179._8_4_ = 2;
                              auVar179._0_8_ = 0x200000002;
                              auVar179._12_4_ = 2;
                              auVar179._16_4_ = 2;
                              auVar179._20_4_ = 2;
                              auVar179._24_4_ = 2;
                              auVar179._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar179,ZEXT1632(auVar44));
                              local_140 = auVar44._0_4_;
                              local_180[0] = (RTCHitN)auVar75[0];
                              local_180[1] = (RTCHitN)auVar75[1];
                              local_180[2] = (RTCHitN)auVar75[2];
                              local_180[3] = (RTCHitN)auVar75[3];
                              local_180[4] = (RTCHitN)auVar75[4];
                              local_180[5] = (RTCHitN)auVar75[5];
                              local_180[6] = (RTCHitN)auVar75[6];
                              local_180[7] = (RTCHitN)auVar75[7];
                              local_180[8] = (RTCHitN)auVar75[8];
                              local_180[9] = (RTCHitN)auVar75[9];
                              local_180[10] = (RTCHitN)auVar75[10];
                              local_180[0xb] = (RTCHitN)auVar75[0xb];
                              local_180[0xc] = (RTCHitN)auVar75[0xc];
                              local_180[0xd] = (RTCHitN)auVar75[0xd];
                              local_180[0xe] = (RTCHitN)auVar75[0xe];
                              local_180[0xf] = (RTCHitN)auVar75[0xf];
                              local_180[0x10] = (RTCHitN)auVar75[0x10];
                              local_180[0x11] = (RTCHitN)auVar75[0x11];
                              local_180[0x12] = (RTCHitN)auVar75[0x12];
                              local_180[0x13] = (RTCHitN)auVar75[0x13];
                              local_180[0x14] = (RTCHitN)auVar75[0x14];
                              local_180[0x15] = (RTCHitN)auVar75[0x15];
                              local_180[0x16] = (RTCHitN)auVar75[0x16];
                              local_180[0x17] = (RTCHitN)auVar75[0x17];
                              local_180[0x18] = (RTCHitN)auVar75[0x18];
                              local_180[0x19] = (RTCHitN)auVar75[0x19];
                              local_180[0x1a] = (RTCHitN)auVar75[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar75[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar75[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar75[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar75[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar75[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_200._0_8_;
                              uStack_d8 = local_200._8_8_;
                              uStack_d0 = local_200._16_8_;
                              uStack_c8 = local_200._24_8_;
                              local_c0 = local_220;
                              vpcmpeqd_avx2(local_220,local_220);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar239;
                              local_400 = local_240._0_8_;
                              uStack_3f8 = local_240._8_8_;
                              uStack_3f0 = local_240._16_8_;
                              uStack_3e8 = local_240._24_8_;
                              local_430.valid = (int *)&local_400;
                              local_430.geometryUserPtr = pGVar6->userPtr;
                              local_430.context = context->user;
                              local_430.ray = (RTCRayN *)ray;
                              local_430.hit = local_180;
                              local_430.N = 8;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&local_430);
                                auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar281 = ZEXT3264(auVar75);
                                auVar283 = ZEXT464(0x3f800000);
                                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar280 = ZEXT1664(auVar44);
                                auVar44 = vxorps_avx512vl(auVar49,auVar49);
                                auVar285 = ZEXT1664(auVar44);
                                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar282 = ZEXT1664(auVar44);
                              }
                              auVar44 = auVar285._0_16_;
                              auVar29._8_8_ = uStack_3f8;
                              auVar29._0_8_ = local_400;
                              auVar29._16_8_ = uStack_3f0;
                              auVar29._24_8_ = uStack_3e8;
                              if (auVar29 == (undefined1  [32])0x0) {
                                bVar42 = false;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var9)(&local_430);
                                  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar281 = ZEXT3264(auVar75);
                                  auVar283 = ZEXT464(0x3f800000);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar280 = ZEXT1664(auVar67);
                                  auVar44 = vxorps_avx512vl(auVar44,auVar44);
                                  auVar285 = ZEXT1664(auVar44);
                                  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar282 = ZEXT1664(auVar44);
                                }
                                auVar30._8_8_ = uStack_3f8;
                                auVar30._0_8_ = local_400;
                                auVar30._16_8_ = uStack_3f0;
                                auVar30._24_8_ = uStack_3e8;
                                uVar1 = vptestmd_avx512vl(auVar30,auVar30);
                                auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar42 = (bool)((byte)uVar1 & 1);
                                bVar14 = (bool)((byte)(uVar1 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar1 >> 2) & 1);
                                bVar16 = (bool)((byte)(uVar1 >> 3) & 1);
                                bVar17 = (bool)((byte)(uVar1 >> 4) & 1);
                                bVar18 = (bool)((byte)(uVar1 >> 5) & 1);
                                bVar19 = (bool)((byte)(uVar1 >> 6) & 1);
                                bVar20 = SUB81(uVar1 >> 7,0);
                                *(uint *)(local_430.ray + 0x100) =
                                     (uint)bVar42 * auVar75._0_4_ |
                                     (uint)!bVar42 * *(int *)(local_430.ray + 0x100);
                                *(uint *)(local_430.ray + 0x104) =
                                     (uint)bVar14 * auVar75._4_4_ |
                                     (uint)!bVar14 * *(int *)(local_430.ray + 0x104);
                                *(uint *)(local_430.ray + 0x108) =
                                     (uint)bVar15 * auVar75._8_4_ |
                                     (uint)!bVar15 * *(int *)(local_430.ray + 0x108);
                                *(uint *)(local_430.ray + 0x10c) =
                                     (uint)bVar16 * auVar75._12_4_ |
                                     (uint)!bVar16 * *(int *)(local_430.ray + 0x10c);
                                *(uint *)(local_430.ray + 0x110) =
                                     (uint)bVar17 * auVar75._16_4_ |
                                     (uint)!bVar17 * *(int *)(local_430.ray + 0x110);
                                *(uint *)(local_430.ray + 0x114) =
                                     (uint)bVar18 * auVar75._20_4_ |
                                     (uint)!bVar18 * *(int *)(local_430.ray + 0x114);
                                *(uint *)(local_430.ray + 0x118) =
                                     (uint)bVar19 * auVar75._24_4_ |
                                     (uint)!bVar19 * *(int *)(local_430.ray + 0x118);
                                *(uint *)(local_430.ray + 0x11c) =
                                     (uint)bVar20 * auVar75._28_4_ |
                                     (uint)!bVar20 * *(int *)(local_430.ray + 0x11c);
                                bVar42 = auVar30 != (undefined1  [32])0x0;
                              }
                              if (!bVar42) {
                                *(float *)(ray + k * 4 + 0x100) = fVar241;
                              }
                            }
                            auVar279 = ZEXT1664(auVar53);
                            bVar41 = (bool)(bVar41 | bVar42);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar38 = lVar38 + -1;
              } while (lVar38 != 0);
            }
          }
        }
      }
    } while (bVar23);
    auVar44 = vinsertps_avx512f(auVar54,auVar47,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }